

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx512::CurveNiMBIntersector1<4>::
     intersect_t<embree::avx512::RibbonCurve1Intersector1<embree::BSplineCurveT,8>,embree::avx512::Intersect1EpilogMU<8,true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  Primitive PVar7;
  int iVar8;
  __int_type_conflict _Var9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined8 uVar24;
  long lVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  byte bVar74;
  byte bVar75;
  ulong uVar76;
  uint uVar77;
  uint uVar78;
  uint uVar79;
  long lVar80;
  Geometry *pGVar81;
  long lVar82;
  uint uVar83;
  ulong uVar84;
  byte bVar85;
  float fVar86;
  float fVar87;
  float fVar138;
  float fVar140;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar98 [16];
  float fVar139;
  float fVar141;
  float fVar142;
  float fVar143;
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  float fVar144;
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined4 uVar145;
  undefined8 uVar146;
  vint4 bi_2;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  vint4 bi_1;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  vint4 bi;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  float fVar173;
  float fVar174;
  float fVar176;
  undefined1 auVar175 [32];
  float fVar177;
  float fVar178;
  float fVar193;
  float fVar194;
  vint4 ai_2;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  float fVar195;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  vint4 ai_1;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  vint4 ai;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [32];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [32];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [32];
  undefined1 auVar213 [16];
  undefined1 auVar214 [64];
  undefined1 auVar215 [16];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [64];
  undefined1 auVar219 [64];
  undefined1 auVar220 [64];
  undefined1 auVar221 [64];
  undefined1 auVar222 [64];
  undefined1 auVar223 [64];
  undefined1 auVar224 [16];
  undefined1 auVar225 [64];
  undefined1 auVar226 [64];
  undefined1 auVar227 [64];
  undefined1 auVar228 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_8> bhit;
  int local_5fc;
  ulong local_5f8;
  ulong local_5f0;
  Precalculations *local_5e8;
  RTCFilterFunctionNArguments local_5e0;
  undefined1 local_5b0 [16];
  undefined8 local_5a0;
  undefined4 local_598;
  float local_594;
  undefined4 local_590;
  undefined4 local_58c;
  undefined4 local_588;
  uint local_584;
  uint local_580;
  Geometry *local_568;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  undefined1 local_510 [8];
  undefined8 uStack_508;
  undefined1 local_500 [16];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  undefined8 local_410;
  undefined8 uStack_408;
  float local_400;
  undefined4 uStack_3fc;
  undefined8 uStack_3f8;
  Primitive *local_3e8;
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined4 local_320;
  undefined4 uStack_31c;
  undefined4 uStack_318;
  undefined4 uStack_314;
  undefined4 uStack_310;
  undefined4 uStack_30c;
  undefined4 uStack_308;
  undefined4 uStack_304;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined4 local_280;
  int local_27c;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  byte local_230;
  float local_220 [4];
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_170 [16];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined4 uStack_c4;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar7 = prim[1];
  uVar76 = (ulong)(byte)PVar7;
  lVar25 = uVar76 * 0x25;
  fVar174 = *(float *)(prim + lVar25 + 0x12);
  auVar95 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + lVar25 + 6));
  auVar159._0_4_ = fVar174 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar159._4_4_ = fVar174 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar159._8_4_ = fVar174 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar159._12_4_ = fVar174 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar96 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 4 + 6)));
  auVar179._0_4_ = fVar174 * auVar95._0_4_;
  auVar179._4_4_ = fVar174 * auVar95._4_4_;
  auVar179._8_4_ = fVar174 * auVar95._8_4_;
  auVar179._12_4_ = fVar174 * auVar95._12_4_;
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar95 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 5 + 6)));
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar89 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 6 + 6)));
  auVar224 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 0xf + 6)));
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar224 = vcvtdq2ps_avx(auVar224);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar7 * 0x10 + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar90 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar7 * 0x10 + uVar76 + 6)));
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 0x1a + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 0x1b + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar91 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 0x1c + 6)));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar196._4_4_ = auVar159._0_4_;
  auVar196._0_4_ = auVar159._0_4_;
  auVar196._8_4_ = auVar159._0_4_;
  auVar196._12_4_ = auVar159._0_4_;
  auVar22 = vshufps_avx(auVar159,auVar159,0x55);
  auVar23 = vshufps_avx(auVar159,auVar159,0xaa);
  fVar174 = auVar23._0_4_;
  auVar160._0_4_ = fVar174 * auVar89._0_4_;
  fVar178 = auVar23._4_4_;
  auVar160._4_4_ = fVar178 * auVar89._4_4_;
  fVar173 = auVar23._8_4_;
  auVar160._8_4_ = fVar173 * auVar89._8_4_;
  fVar177 = auVar23._12_4_;
  auVar160._12_4_ = fVar177 * auVar89._12_4_;
  auVar155._0_4_ = auVar90._0_4_ * fVar174;
  auVar155._4_4_ = auVar90._4_4_ * fVar178;
  auVar155._8_4_ = auVar90._8_4_ * fVar173;
  auVar155._12_4_ = auVar90._12_4_ * fVar177;
  auVar98._0_4_ = auVar91._0_4_ * fVar174;
  auVar98._4_4_ = auVar91._4_4_ * fVar178;
  auVar98._8_4_ = auVar91._8_4_ * fVar173;
  auVar98._12_4_ = auVar91._12_4_ * fVar177;
  auVar23 = vfmadd231ps_fma(auVar160,auVar22,auVar95);
  auVar26 = vfmadd231ps_fma(auVar155,auVar22,auVar19);
  auVar22 = vfmadd231ps_fma(auVar98,auVar21,auVar22);
  auVar23 = vfmadd231ps_fma(auVar23,auVar196,auVar96);
  auVar26 = vfmadd231ps_fma(auVar26,auVar196,auVar224);
  auVar27 = vfmadd231ps_fma(auVar22,auVar20,auVar196);
  auVar213._4_4_ = auVar179._0_4_;
  auVar213._0_4_ = auVar179._0_4_;
  auVar213._8_4_ = auVar179._0_4_;
  auVar213._12_4_ = auVar179._0_4_;
  auVar22 = vshufps_avx(auVar179,auVar179,0x55);
  auVar88 = vshufps_avx512vl(auVar179,auVar179,0xaa);
  auVar89 = vmulps_avx512vl(auVar88,auVar89);
  auVar90 = vmulps_avx512vl(auVar88,auVar90);
  auVar91 = vmulps_avx512vl(auVar88,auVar91);
  auVar95 = vfmadd231ps_fma(auVar89,auVar22,auVar95);
  auVar89 = vfmadd231ps_fma(auVar90,auVar22,auVar19);
  auVar19 = vfmadd231ps_fma(auVar91,auVar22,auVar21);
  auVar28 = vfmadd231ps_fma(auVar95,auVar213,auVar96);
  auVar98 = vfmadd231ps_fma(auVar89,auVar213,auVar224);
  auVar205._8_4_ = 0x7fffffff;
  auVar205._0_8_ = 0x7fffffff7fffffff;
  auVar205._12_4_ = 0x7fffffff;
  auVar147 = vfmadd231ps_fma(auVar19,auVar213,auVar20);
  auVar96 = vandps_avx(auVar205,auVar23);
  auVar202._8_4_ = 0x219392ef;
  auVar202._0_8_ = 0x219392ef219392ef;
  auVar202._12_4_ = 0x219392ef;
  uVar84 = vcmpps_avx512vl(auVar96,auVar202,1);
  bVar12 = (bool)((byte)uVar84 & 1);
  auVar92._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar23._0_4_;
  bVar12 = (bool)((byte)(uVar84 >> 1) & 1);
  auVar92._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar23._4_4_;
  bVar12 = (bool)((byte)(uVar84 >> 2) & 1);
  auVar92._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar23._8_4_;
  bVar12 = (bool)((byte)(uVar84 >> 3) & 1);
  auVar92._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar23._12_4_;
  auVar96 = vandps_avx(auVar205,auVar26);
  uVar84 = vcmpps_avx512vl(auVar96,auVar202,1);
  bVar12 = (bool)((byte)uVar84 & 1);
  auVar93._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar26._0_4_;
  bVar12 = (bool)((byte)(uVar84 >> 1) & 1);
  auVar93._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar26._4_4_;
  bVar12 = (bool)((byte)(uVar84 >> 2) & 1);
  auVar93._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar26._8_4_;
  bVar12 = (bool)((byte)(uVar84 >> 3) & 1);
  auVar93._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar26._12_4_;
  auVar96 = vandps_avx(auVar205,auVar27);
  uVar84 = vcmpps_avx512vl(auVar96,auVar202,1);
  bVar12 = (bool)((byte)uVar84 & 1);
  auVar94._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar27._0_4_;
  bVar12 = (bool)((byte)(uVar84 >> 1) & 1);
  auVar94._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar27._4_4_;
  bVar12 = (bool)((byte)(uVar84 >> 2) & 1);
  auVar94._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar27._8_4_;
  bVar12 = (bool)((byte)(uVar84 >> 3) & 1);
  auVar94._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar27._12_4_;
  auVar95 = vrcp14ps_avx512vl(auVar92);
  auVar203._8_4_ = 0x3f800000;
  auVar203._0_8_ = &DAT_3f8000003f800000;
  auVar203._12_4_ = 0x3f800000;
  auVar96 = vfnmadd213ps_fma(auVar92,auVar95,auVar203);
  auVar27 = vfmadd132ps_fma(auVar96,auVar95,auVar95);
  auVar95 = vrcp14ps_avx512vl(auVar93);
  auVar96 = vfnmadd213ps_fma(auVar93,auVar95,auVar203);
  auVar88 = vfmadd132ps_fma(auVar96,auVar95,auVar95);
  auVar95 = vrcp14ps_avx512vl(auVar94);
  auVar96 = vfnmadd213ps_fma(auVar94,auVar95,auVar203);
  auVar97 = vfmadd132ps_fma(auVar96,auVar95,auVar95);
  fVar174 = ((ray->super_RayK<1>).dir.field_0.m128[3] - *(float *)(prim + lVar25 + 0x16)) *
            *(float *)(prim + lVar25 + 0x1a);
  auVar200._4_4_ = fVar174;
  auVar200._0_4_ = fVar174;
  auVar200._8_4_ = fVar174;
  auVar200._12_4_ = fVar174;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = *(ulong *)(prim + uVar76 * 7 + 6);
  auVar96 = vpmovsxwd_avx(auVar96);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar95._8_8_ = 0;
  auVar95._0_8_ = *(ulong *)(prim + uVar76 * 0xb + 6);
  auVar95 = vpmovsxwd_avx(auVar95);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar224 = vsubps_avx(auVar95,auVar96);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + uVar76 * 9 + 6);
  auVar95 = vpmovsxwd_avx(auVar89);
  auVar89 = vfmadd213ps_fma(auVar224,auVar200,auVar96);
  auVar96 = vcvtdq2ps_avx(auVar95);
  auVar224._8_8_ = 0;
  auVar224._0_8_ = *(ulong *)(prim + uVar76 * 0xd + 6);
  auVar95 = vpmovsxwd_avx(auVar224);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,auVar96);
  auVar224 = vfmadd213ps_fma(auVar95,auVar200,auVar96);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar76 * 0x12 + 6);
  auVar96 = vpmovsxwd_avx(auVar19);
  auVar96 = vcvtdq2ps_avx(auVar96);
  uVar84 = (ulong)(uint)((int)(uVar76 * 5) << 2);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + uVar76 * 2 + uVar84 + 6);
  auVar95 = vpmovsxwd_avx(auVar90);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,auVar96);
  auVar19 = vfmadd213ps_fma(auVar95,auVar200,auVar96);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar84 + 6);
  auVar96 = vpmovsxwd_avx(auVar20);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar76 * 0x18 + 6);
  auVar95 = vpmovsxwd_avx(auVar21);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,auVar96);
  auVar90 = vfmadd213ps_fma(auVar95,auVar200,auVar96);
  auVar91._8_8_ = 0;
  auVar91._0_8_ = *(ulong *)(prim + uVar76 * 0x1d + 6);
  auVar96 = vpmovsxwd_avx(auVar91);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar76 + (ulong)(byte)PVar7 * 0x20 + 6);
  auVar95 = vpmovsxwd_avx(auVar22);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,auVar96);
  auVar20 = vfmadd213ps_fma(auVar95,auVar200,auVar96);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar7 * 0x20 - uVar76) + 6);
  auVar96 = vpmovsxwd_avx(auVar23);
  auVar96 = vcvtdq2ps_avx(auVar96);
  local_3e8 = prim;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + uVar76 * 0x23 + 6);
  auVar95 = vpmovsxwd_avx(auVar26);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,auVar96);
  auVar95 = vfmadd213ps_fma(auVar95,auVar200,auVar96);
  auVar96 = vsubps_avx(auVar89,auVar28);
  auVar201._0_4_ = auVar27._0_4_ * auVar96._0_4_;
  auVar201._4_4_ = auVar27._4_4_ * auVar96._4_4_;
  auVar201._8_4_ = auVar27._8_4_ * auVar96._8_4_;
  auVar201._12_4_ = auVar27._12_4_ * auVar96._12_4_;
  auVar96 = vsubps_avx(auVar224,auVar28);
  auVar161._0_4_ = auVar27._0_4_ * auVar96._0_4_;
  auVar161._4_4_ = auVar27._4_4_ * auVar96._4_4_;
  auVar161._8_4_ = auVar27._8_4_ * auVar96._8_4_;
  auVar161._12_4_ = auVar27._12_4_ * auVar96._12_4_;
  auVar96 = vsubps_avx(auVar19,auVar98);
  auVar197._0_4_ = auVar88._0_4_ * auVar96._0_4_;
  auVar197._4_4_ = auVar88._4_4_ * auVar96._4_4_;
  auVar197._8_4_ = auVar88._8_4_ * auVar96._8_4_;
  auVar197._12_4_ = auVar88._12_4_ * auVar96._12_4_;
  auVar96 = vsubps_avx(auVar90,auVar98);
  auVar156._0_4_ = auVar88._0_4_ * auVar96._0_4_;
  auVar156._4_4_ = auVar88._4_4_ * auVar96._4_4_;
  auVar156._8_4_ = auVar88._8_4_ * auVar96._8_4_;
  auVar156._12_4_ = auVar88._12_4_ * auVar96._12_4_;
  auVar96 = vsubps_avx(auVar20,auVar147);
  auVar180._0_4_ = auVar97._0_4_ * auVar96._0_4_;
  auVar180._4_4_ = auVar97._4_4_ * auVar96._4_4_;
  auVar180._8_4_ = auVar97._8_4_ * auVar96._8_4_;
  auVar180._12_4_ = auVar97._12_4_ * auVar96._12_4_;
  auVar96 = vsubps_avx(auVar95,auVar147);
  auVar147._0_4_ = auVar97._0_4_ * auVar96._0_4_;
  auVar147._4_4_ = auVar97._4_4_ * auVar96._4_4_;
  auVar147._8_4_ = auVar97._8_4_ * auVar96._8_4_;
  auVar147._12_4_ = auVar97._12_4_ * auVar96._12_4_;
  auVar96 = vpminsd_avx(auVar201,auVar161);
  auVar95 = vpminsd_avx(auVar197,auVar156);
  auVar96 = vmaxps_avx(auVar96,auVar95);
  auVar95 = vpminsd_avx(auVar180,auVar147);
  uVar145 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar27._4_4_ = uVar145;
  auVar27._0_4_ = uVar145;
  auVar27._8_4_ = uVar145;
  auVar27._12_4_ = uVar145;
  auVar95 = vmaxps_avx512vl(auVar95,auVar27);
  auVar96 = vmaxps_avx(auVar96,auVar95);
  auVar88._8_4_ = 0x3f7ffffa;
  auVar88._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar88._12_4_ = 0x3f7ffffa;
  local_170 = vmulps_avx512vl(auVar96,auVar88);
  auVar96 = vpmaxsd_avx(auVar201,auVar161);
  auVar95 = vpmaxsd_avx(auVar197,auVar156);
  auVar96 = vminps_avx(auVar96,auVar95);
  auVar95 = vpmaxsd_avx(auVar180,auVar147);
  fVar174 = (ray->super_RayK<1>).tfar;
  auVar97._4_4_ = fVar174;
  auVar97._0_4_ = fVar174;
  auVar97._8_4_ = fVar174;
  auVar97._12_4_ = fVar174;
  auVar95 = vminps_avx512vl(auVar95,auVar97);
  auVar96 = vminps_avx(auVar96,auVar95);
  auVar28._8_4_ = 0x3f800003;
  auVar28._0_8_ = 0x3f8000033f800003;
  auVar28._12_4_ = 0x3f800003;
  auVar96 = vmulps_avx512vl(auVar96,auVar28);
  local_5e8 = pre;
  auVar95 = vpbroadcastd_avx512vl();
  uVar146 = vcmpps_avx512vl(local_170,auVar96,2);
  uVar84 = vpcmpgtd_avx512vl(auVar95,_DAT_01ff0cf0);
  uVar84 = ((byte)uVar146 & 0xf) & uVar84;
  if ((char)uVar84 != '\0') {
    do {
      lVar25 = 0;
      for (uVar76 = uVar84; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x8000000000000000) {
        lVar25 = lVar25 + 1;
      }
      uVar83 = *(uint *)(local_3e8 + 2);
      uVar79 = *(uint *)(local_3e8 + lVar25 * 4 + 6);
      local_5f8 = (ulong)uVar83;
      pGVar81 = (context->scene->geometries).items[uVar83].ptr;
      local_5f0 = (ulong)uVar79;
      uVar76 = (ulong)*(uint *)(*(long *)&pGVar81->field_0x58 +
                               (ulong)uVar79 *
                               pGVar81[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar174 = (pGVar81->time_range).lower;
      fVar174 = pGVar81->fnumTimeSegments *
                (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar174) /
                ((pGVar81->time_range).upper - fVar174));
      auVar96 = vroundss_avx(ZEXT416((uint)fVar174),ZEXT416((uint)fVar174),9);
      auVar96 = vminss_avx(auVar96,ZEXT416((uint)(pGVar81->fnumTimeSegments + -1.0)));
      auVar96 = vmaxss_avx(ZEXT816(0) << 0x20,auVar96);
      fVar174 = fVar174 - auVar96._0_4_;
      _Var9 = pGVar81[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar80 = (long)(int)auVar96._0_4_ * 0x38;
      lVar25 = *(long *)(_Var9 + 0x10 + lVar80);
      lVar82 = *(long *)(_Var9 + 0x38 + lVar80);
      lVar10 = *(long *)(_Var9 + 0x48 + lVar80);
      auVar157._4_4_ = fVar174;
      auVar157._0_4_ = fVar174;
      auVar157._8_4_ = fVar174;
      auVar157._12_4_ = fVar174;
      pfVar3 = (float *)(lVar82 + uVar76 * lVar10);
      auVar206._0_4_ = fVar174 * *pfVar3;
      auVar206._4_4_ = fVar174 * pfVar3[1];
      auVar206._8_4_ = fVar174 * pfVar3[2];
      auVar206._12_4_ = fVar174 * pfVar3[3];
      pfVar3 = (float *)(lVar82 + (uVar76 + 1) * lVar10);
      auVar207._0_4_ = fVar174 * *pfVar3;
      auVar207._4_4_ = fVar174 * pfVar3[1];
      auVar207._8_4_ = fVar174 * pfVar3[2];
      auVar207._12_4_ = fVar174 * pfVar3[3];
      auVar96 = vmulps_avx512vl(auVar157,*(undefined1 (*) [16])(lVar82 + (uVar76 + 2) * lVar10));
      auVar95 = vmulps_avx512vl(auVar157,*(undefined1 (*) [16])(lVar82 + lVar10 * (uVar76 + 3)));
      lVar82 = *(long *)(_Var9 + lVar80);
      fVar174 = 1.0 - fVar174;
      auVar148._4_4_ = fVar174;
      auVar148._0_4_ = fVar174;
      auVar148._8_4_ = fVar174;
      auVar148._12_4_ = fVar174;
      local_5b0 = vfmadd231ps_fma(auVar206,auVar148,*(undefined1 (*) [16])(lVar82 + lVar25 * uVar76)
                                 );
      local_4f0 = vfmadd231ps_fma(auVar207,auVar148,
                                  *(undefined1 (*) [16])(lVar82 + lVar25 * (uVar76 + 1)));
      local_500 = vfmadd231ps_avx512vl
                            (auVar96,auVar148,*(undefined1 (*) [16])(lVar82 + lVar25 * (uVar76 + 2))
                            );
      _local_510 = vfmadd231ps_avx512vl
                             (auVar95,auVar148,
                              *(undefined1 (*) [16])(lVar82 + lVar25 * (uVar76 + 3)));
      iVar8 = (int)pGVar81[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar25 = (long)iVar8 * 0x44;
      aVar4 = (ray->super_RayK<1>).org.field_0;
      auVar95 = vsubps_avx(local_5b0,(undefined1  [16])aVar4);
      uVar145 = auVar95._0_4_;
      auVar162._4_4_ = uVar145;
      auVar162._0_4_ = uVar145;
      auVar162._8_4_ = uVar145;
      auVar162._12_4_ = uVar145;
      auVar96 = vshufps_avx(auVar95,auVar95,0x55);
      aVar5 = (local_5e8->ray_space).vx.field_0;
      aVar6 = (local_5e8->ray_space).vy.field_0;
      fVar174 = (local_5e8->ray_space).vz.field_0.m128[0];
      fVar178 = (local_5e8->ray_space).vz.field_0.m128[1];
      fVar173 = (local_5e8->ray_space).vz.field_0.m128[2];
      fVar177 = (local_5e8->ray_space).vz.field_0.m128[3];
      auVar95 = vshufps_avx(auVar95,auVar95,0xaa);
      auVar209._0_4_ = auVar95._0_4_ * fVar174;
      auVar209._4_4_ = auVar95._4_4_ * fVar178;
      auVar209._8_4_ = auVar95._8_4_ * fVar173;
      auVar209._12_4_ = auVar95._12_4_ * fVar177;
      auVar96 = vfmadd231ps_fma(auVar209,(undefined1  [16])aVar6,auVar96);
      auVar89 = vfmadd231ps_fma(auVar96,(undefined1  [16])aVar5,auVar162);
      auVar95 = vsubps_avx(local_4f0,(undefined1  [16])aVar4);
      uVar145 = auVar95._0_4_;
      auVar163._4_4_ = uVar145;
      auVar163._0_4_ = uVar145;
      auVar163._8_4_ = uVar145;
      auVar163._12_4_ = uVar145;
      auVar96 = vshufps_avx(auVar95,auVar95,0x55);
      auVar95 = vshufps_avx(auVar95,auVar95,0xaa);
      auVar210._0_4_ = auVar95._0_4_ * fVar174;
      auVar210._4_4_ = auVar95._4_4_ * fVar178;
      auVar210._8_4_ = auVar95._8_4_ * fVar173;
      auVar210._12_4_ = auVar95._12_4_ * fVar177;
      auVar96 = vfmadd231ps_fma(auVar210,(undefined1  [16])aVar6,auVar96);
      auVar224 = vfmadd231ps_fma(auVar96,(undefined1  [16])aVar5,auVar163);
      auVar95 = vsubps_avx512vl(local_500,(undefined1  [16])aVar4);
      uVar145 = auVar95._0_4_;
      auVar164._4_4_ = uVar145;
      auVar164._0_4_ = uVar145;
      auVar164._8_4_ = uVar145;
      auVar164._12_4_ = uVar145;
      auVar96 = vshufps_avx(auVar95,auVar95,0x55);
      auVar95 = vshufps_avx(auVar95,auVar95,0xaa);
      auVar211._0_4_ = auVar95._0_4_ * fVar174;
      auVar211._4_4_ = auVar95._4_4_ * fVar178;
      auVar211._8_4_ = auVar95._8_4_ * fVar173;
      auVar211._12_4_ = auVar95._12_4_ * fVar177;
      auVar96 = vfmadd231ps_fma(auVar211,(undefined1  [16])aVar6,auVar96);
      auVar19 = vfmadd231ps_fma(auVar96,(undefined1  [16])aVar5,auVar164);
      auVar95 = vsubps_avx512vl(_local_510,(undefined1  [16])aVar4);
      uVar145 = auVar95._0_4_;
      auVar158._4_4_ = uVar145;
      auVar158._0_4_ = uVar145;
      auVar158._8_4_ = uVar145;
      auVar158._12_4_ = uVar145;
      auVar96 = vshufps_avx(auVar95,auVar95,0x55);
      auVar95 = vshufps_avx(auVar95,auVar95,0xaa);
      auVar215._0_4_ = auVar95._0_4_ * fVar174;
      auVar215._4_4_ = auVar95._4_4_ * fVar178;
      auVar215._8_4_ = auVar95._8_4_ * fVar173;
      auVar215._12_4_ = auVar95._12_4_ * fVar177;
      auVar96 = vfmadd231ps_fma(auVar215,(undefined1  [16])aVar6,auVar96);
      auVar90 = vfmadd231ps_fma(auVar96,(undefined1  [16])aVar5,auVar158);
      auVar114 = *(undefined1 (*) [32])(bspline_basis0 + lVar25);
      uVar145 = auVar89._0_4_;
      local_360._4_4_ = uVar145;
      local_360._0_4_ = uVar145;
      local_360._8_4_ = uVar145;
      local_360._12_4_ = uVar145;
      local_360._16_4_ = uVar145;
      local_360._20_4_ = uVar145;
      local_360._24_4_ = uVar145;
      local_360._28_4_ = uVar145;
      auVar116 = *(undefined1 (*) [32])(bspline_basis0 + lVar25 + 0x484);
      auVar99._8_4_ = 1;
      auVar99._0_8_ = 0x100000001;
      auVar99._12_4_ = 1;
      auVar99._16_4_ = 1;
      auVar99._20_4_ = 1;
      auVar99._24_4_ = 1;
      auVar99._28_4_ = 1;
      local_340 = vpermps_avx2(auVar99,ZEXT1632(auVar89));
      local_380 = vbroadcastss_avx512vl(auVar224);
      local_540 = vpermps_avx512vl(auVar99,ZEXT1632(auVar224));
      auVar112 = *(undefined1 (*) [32])(bspline_basis0 + lVar25 + 0x908);
      local_560 = vbroadcastss_avx512vl(auVar19);
      local_460 = vpermps_avx512vl(auVar99,ZEXT1632(auVar19));
      auVar111 = *(undefined1 (*) [32])(bspline_basis0 + lVar25 + 0xd8c);
      local_480 = vbroadcastss_avx512vl(auVar90);
      auVar227 = ZEXT3264(local_480);
      local_4a0 = vpermps_avx512vl(auVar99,ZEXT1632(auVar90));
      auVar228 = ZEXT3264(local_4a0);
      auVar99 = vmulps_avx512vl(local_480,auVar111);
      auVar100 = vmulps_avx512vl(local_4a0,auVar111);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar112,local_560);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar112,local_460);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar116,local_380);
      auVar101 = vfmadd231ps_avx512vl(auVar100,auVar116,local_540);
      auVar102 = vfmadd231ps_avx512vl(auVar99,auVar114,local_360);
      auVar99 = *(undefined1 (*) [32])(bspline_basis1 + lVar25);
      auVar100 = *(undefined1 (*) [32])(bspline_basis1 + lVar25 + 0x484);
      auVar110 = *(undefined1 (*) [32])(bspline_basis1 + lVar25 + 0x908);
      auVar103 = vfmadd231ps_avx512vl(auVar101,auVar114,local_340);
      auVar101 = *(undefined1 (*) [32])(bspline_basis1 + lVar25 + 0xd8c);
      auVar104 = vmulps_avx512vl(local_480,auVar101);
      auVar105 = vmulps_avx512vl(local_4a0,auVar101);
      auVar104 = vfmadd231ps_avx512vl(auVar104,auVar110,local_560);
      auVar105 = vfmadd231ps_avx512vl(auVar105,auVar110,local_460);
      auVar104 = vfmadd231ps_avx512vl(auVar104,auVar100,local_380);
      auVar105 = vfmadd231ps_avx512vl(auVar105,auVar100,local_540);
      auVar20 = vfmadd231ps_fma(auVar104,auVar99,local_360);
      auVar21 = vfmadd231ps_fma(auVar105,auVar99,local_340);
      auVar105 = vsubps_avx512vl(ZEXT1632(auVar20),auVar102);
      auVar106 = vsubps_avx512vl(ZEXT1632(auVar21),auVar103);
      auVar104 = vmulps_avx512vl(auVar103,auVar105);
      auVar107 = vmulps_avx512vl(auVar102,auVar106);
      auVar104 = vsubps_avx512vl(auVar104,auVar107);
      auVar96 = vshufps_avx(local_5b0,local_5b0,0xff);
      uVar146 = auVar96._0_8_;
      local_80._8_8_ = uVar146;
      local_80._0_8_ = uVar146;
      local_80._16_8_ = uVar146;
      local_80._24_8_ = uVar146;
      auVar96 = vshufps_avx(local_4f0,local_4f0,0xff);
      local_a0 = vbroadcastsd_avx512vl(auVar96);
      auVar96 = vshufps_avx512vl(local_500,local_500,0xff);
      local_c0 = vbroadcastsd_avx512vl(auVar96);
      auVar96 = vshufps_avx512vl(_local_510,_local_510,0xff);
      uVar146 = auVar96._0_8_;
      register0x00001248 = uVar146;
      local_e0 = uVar146;
      register0x00001250 = uVar146;
      register0x00001258 = uVar146;
      auVar107 = vmulps_avx512vl(_local_e0,auVar111);
      auVar107 = vfmadd231ps_avx512vl(auVar107,auVar112,local_c0);
      auVar107 = vfmadd231ps_avx512vl(auVar107,auVar116,local_a0);
      auVar107 = vfmadd231ps_avx512vl(auVar107,auVar114,local_80);
      auVar108 = vmulps_avx512vl(_local_e0,auVar101);
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar110,local_c0);
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar100,local_a0);
      auVar91 = vfmadd231ps_fma(auVar108,auVar99,local_80);
      auVar108 = vmulps_avx512vl(auVar106,auVar106);
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar105,auVar105);
      auVar109 = vmaxps_avx512vl(auVar107,ZEXT1632(auVar91));
      auVar109 = vmulps_avx512vl(auVar109,auVar109);
      auVar108 = vmulps_avx512vl(auVar109,auVar108);
      auVar104 = vmulps_avx512vl(auVar104,auVar104);
      uVar146 = vcmpps_avx512vl(auVar104,auVar108,2);
      auVar22 = local_5b0;
      auVar96 = vblendps_avx(auVar89,local_5b0,8);
      auVar88 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar95 = vandps_avx512vl(auVar96,auVar88);
      auVar27 = local_4f0;
      auVar96 = vblendps_avx(auVar224,local_4f0,8);
      auVar96 = vandps_avx512vl(auVar96,auVar88);
      auVar95 = vmaxps_avx(auVar95,auVar96);
      auVar26 = local_500;
      auVar96 = vblendps_avx(auVar19,local_500,8);
      auVar97 = vandps_avx512vl(auVar96,auVar88);
      auVar23 = _local_510;
      auVar96 = vblendps_avx(auVar90,_local_510,8);
      auVar96 = vandps_avx512vl(auVar96,auVar88);
      auVar96 = vmaxps_avx(auVar97,auVar96);
      auVar96 = vmaxps_avx(auVar95,auVar96);
      auVar95 = vmovshdup_avx(auVar96);
      auVar95 = vmaxss_avx(auVar95,auVar96);
      auVar96 = vshufpd_avx(auVar96,auVar96,1);
      auVar96 = vmaxss_avx(auVar96,auVar95);
      _local_300 = vcvtsi2ss_avx512f(_local_510,iVar8);
      auVar108._0_4_ = local_300._0_4_;
      auVar108._4_4_ = auVar108._0_4_;
      auVar108._8_4_ = auVar108._0_4_;
      auVar108._12_4_ = auVar108._0_4_;
      auVar108._16_4_ = auVar108._0_4_;
      auVar108._20_4_ = auVar108._0_4_;
      auVar108._24_4_ = auVar108._0_4_;
      auVar108._28_4_ = auVar108._0_4_;
      uVar24 = vcmpps_avx512vl(auVar108,_DAT_02020f40,0xe);
      bVar85 = (byte)uVar146 & (byte)uVar24;
      fVar178 = auVar96._0_4_ * 4.7683716e-07;
      auVar104._8_4_ = 2;
      auVar104._0_8_ = 0x200000002;
      auVar104._12_4_ = 2;
      auVar104._16_4_ = 2;
      auVar104._20_4_ = 2;
      auVar104._24_4_ = 2;
      auVar104._28_4_ = 2;
      local_100 = vpermps_avx512vl(auVar104,ZEXT1632(auVar89));
      local_120 = vpermps_avx512vl(auVar104,ZEXT1632(auVar224));
      local_140 = vpermps_avx512vl(auVar104,ZEXT1632(auVar19));
      auVar104 = vpermps_avx2(auVar104,ZEXT1632(auVar90));
      fVar174 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
      auVar96 = auVar106._0_16_;
      _local_520 = ZEXT416((uint)fVar178);
      if (bVar85 == 0) {
        auVar96 = vxorps_avx512vl(auVar96,auVar96);
        auVar225 = ZEXT1664(auVar96);
        auVar221 = ZEXT3264(local_360);
        auVar222 = ZEXT3264(local_340);
        auVar223 = ZEXT3264(local_380);
        auVar219 = ZEXT3264(local_540);
        auVar218 = ZEXT3264(local_560);
        auVar226 = ZEXT3264(local_460);
        local_5b0 = auVar22;
        _local_510 = auVar23;
      }
      else {
        local_3e0 = fVar174;
        fStack_3dc = 0.0;
        fStack_3d8 = 0.0;
        fStack_3d4 = 0.0;
        auVar101 = vmulps_avx512vl(auVar104,auVar101);
        auVar110 = vfmadd213ps_avx512vl(auVar110,local_140,auVar101);
        auVar100 = vfmadd213ps_avx512vl(auVar100,local_120,auVar110);
        auVar109 = vfmadd213ps_avx512vl(auVar99,local_100,auVar100);
        auVar111 = vmulps_avx512vl(auVar104,auVar111);
        auVar112 = vfmadd213ps_avx512vl(auVar112,local_140,auVar111);
        auVar100 = vfmadd213ps_avx512vl(auVar116,local_120,auVar112);
        auVar116 = *(undefined1 (*) [32])(bspline_basis0 + lVar25 + 0x1210);
        auVar112 = *(undefined1 (*) [32])(bspline_basis0 + lVar25 + 0x1694);
        auVar111 = *(undefined1 (*) [32])(bspline_basis0 + lVar25 + 0x1b18);
        auVar99 = *(undefined1 (*) [32])(bspline_basis0 + lVar25 + 0x1f9c);
        auVar113 = vfmadd213ps_avx512vl(auVar114,local_100,auVar100);
        auVar114 = vmulps_avx512vl(local_480,auVar99);
        auVar100 = vmulps_avx512vl(local_4a0,auVar99);
        auVar212._0_4_ = auVar104._0_4_ * auVar99._0_4_;
        auVar212._4_4_ = auVar104._4_4_ * auVar99._4_4_;
        auVar212._8_4_ = auVar104._8_4_ * auVar99._8_4_;
        auVar212._12_4_ = auVar104._12_4_ * auVar99._12_4_;
        auVar212._16_4_ = auVar104._16_4_ * auVar99._16_4_;
        auVar212._20_4_ = auVar104._20_4_ * auVar99._20_4_;
        auVar212._24_4_ = auVar104._24_4_ * auVar99._24_4_;
        auVar212._28_4_ = 0;
        auVar114 = vfmadd231ps_avx512vl(auVar114,auVar111,local_560);
        auVar99 = vfmadd231ps_avx512vl(auVar100,auVar111,local_460);
        auVar111 = vfmadd231ps_avx512vl(auVar212,local_140,auVar111);
        auVar114 = vfmadd231ps_avx512vl(auVar114,auVar112,local_380);
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar112,local_540);
        auVar100 = vfmadd231ps_avx512vl(auVar111,local_120,auVar112);
        auVar110 = vfmadd231ps_avx512vl(auVar114,auVar116,local_360);
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar116,local_340);
        auVar114 = *(undefined1 (*) [32])(bspline_basis1 + lVar25 + 0x1210);
        auVar112 = *(undefined1 (*) [32])(bspline_basis1 + lVar25 + 0x1b18);
        auVar111 = *(undefined1 (*) [32])(bspline_basis1 + lVar25 + 0x1f9c);
        auVar100 = vfmadd231ps_avx512vl(auVar100,local_100,auVar116);
        auVar101 = vmulps_avx512vl(local_480,auVar111);
        auVar115 = vmulps_avx512vl(local_4a0,auVar111);
        local_3c0 = auVar104;
        auVar116._4_4_ = auVar104._4_4_ * auVar111._4_4_;
        auVar116._0_4_ = auVar104._0_4_ * auVar111._0_4_;
        auVar116._8_4_ = auVar104._8_4_ * auVar111._8_4_;
        auVar116._12_4_ = auVar104._12_4_ * auVar111._12_4_;
        auVar116._16_4_ = auVar104._16_4_ * auVar111._16_4_;
        auVar116._20_4_ = auVar104._20_4_ * auVar111._20_4_;
        auVar116._24_4_ = auVar104._24_4_ * auVar111._24_4_;
        auVar116._28_4_ = auVar111._28_4_;
        auVar111 = vfmadd231ps_avx512vl(auVar101,auVar112,local_560);
        auVar101 = vfmadd231ps_avx512vl(auVar115,auVar112,local_460);
        auVar112 = vfmadd231ps_avx512vl(auVar116,local_140,auVar112);
        auVar116 = *(undefined1 (*) [32])(bspline_basis1 + lVar25 + 0x1694);
        auVar111 = vfmadd231ps_avx512vl(auVar111,auVar116,local_380);
        auVar101 = vfmadd231ps_avx512vl(auVar101,auVar116,local_540);
        auVar116 = vfmadd231ps_avx512vl(auVar112,local_120,auVar116);
        auVar112 = vfmadd231ps_avx512vl(auVar111,auVar114,local_360);
        auVar111 = vfmadd231ps_avx512vl(auVar101,auVar114,local_340);
        auVar101 = vfmadd231ps_avx512vl(auVar116,local_100,auVar114);
        auVar216._8_4_ = 0x7fffffff;
        auVar216._0_8_ = 0x7fffffff7fffffff;
        auVar216._12_4_ = 0x7fffffff;
        auVar216._16_4_ = 0x7fffffff;
        auVar216._20_4_ = 0x7fffffff;
        auVar216._24_4_ = 0x7fffffff;
        auVar216._28_4_ = 0x7fffffff;
        auVar114 = vandps_avx(auVar110,auVar216);
        auVar116 = vandps_avx(auVar99,auVar216);
        auVar116 = vmaxps_avx(auVar114,auVar116);
        auVar114 = vandps_avx(auVar100,auVar216);
        auVar114 = vmaxps_avx(auVar116,auVar114);
        auVar100 = vbroadcastss_avx512vl(_local_520);
        uVar76 = vcmpps_avx512vl(auVar114,auVar100,1);
        bVar12 = (bool)((byte)uVar76 & 1);
        auVar115._0_4_ = (float)((uint)bVar12 * auVar105._0_4_ | (uint)!bVar12 * auVar110._0_4_);
        bVar12 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar115._4_4_ = (float)((uint)bVar12 * auVar105._4_4_ | (uint)!bVar12 * auVar110._4_4_);
        bVar12 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar115._8_4_ = (float)((uint)bVar12 * auVar105._8_4_ | (uint)!bVar12 * auVar110._8_4_);
        bVar12 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar115._12_4_ = (float)((uint)bVar12 * auVar105._12_4_ | (uint)!bVar12 * auVar110._12_4_);
        bVar12 = (bool)((byte)(uVar76 >> 4) & 1);
        auVar115._16_4_ = (float)((uint)bVar12 * auVar105._16_4_ | (uint)!bVar12 * auVar110._16_4_);
        bVar12 = (bool)((byte)(uVar76 >> 5) & 1);
        auVar115._20_4_ = (float)((uint)bVar12 * auVar105._20_4_ | (uint)!bVar12 * auVar110._20_4_);
        bVar12 = (bool)((byte)(uVar76 >> 6) & 1);
        auVar115._24_4_ = (float)((uint)bVar12 * auVar105._24_4_ | (uint)!bVar12 * auVar110._24_4_);
        bVar12 = SUB81(uVar76 >> 7,0);
        auVar115._28_4_ = (uint)bVar12 * auVar105._28_4_ | (uint)!bVar12 * auVar110._28_4_;
        bVar12 = (bool)((byte)uVar76 & 1);
        auVar117._0_4_ = (float)((uint)bVar12 * auVar106._0_4_ | (uint)!bVar12 * auVar99._0_4_);
        bVar12 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar117._4_4_ = (float)((uint)bVar12 * auVar106._4_4_ | (uint)!bVar12 * auVar99._4_4_);
        bVar12 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar117._8_4_ = (float)((uint)bVar12 * auVar106._8_4_ | (uint)!bVar12 * auVar99._8_4_);
        bVar12 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar117._12_4_ = (float)((uint)bVar12 * auVar106._12_4_ | (uint)!bVar12 * auVar99._12_4_);
        bVar12 = (bool)((byte)(uVar76 >> 4) & 1);
        auVar117._16_4_ = (float)((uint)bVar12 * auVar106._16_4_ | (uint)!bVar12 * auVar99._16_4_);
        bVar12 = (bool)((byte)(uVar76 >> 5) & 1);
        auVar117._20_4_ = (float)((uint)bVar12 * auVar106._20_4_ | (uint)!bVar12 * auVar99._20_4_);
        bVar12 = (bool)((byte)(uVar76 >> 6) & 1);
        auVar117._24_4_ = (float)((uint)bVar12 * auVar106._24_4_ | (uint)!bVar12 * auVar99._24_4_);
        bVar12 = SUB81(uVar76 >> 7,0);
        auVar117._28_4_ = (uint)bVar12 * auVar106._28_4_ | (uint)!bVar12 * auVar99._28_4_;
        auVar114 = vandps_avx(auVar216,auVar112);
        auVar116 = vandps_avx(auVar111,auVar216);
        auVar116 = vmaxps_avx(auVar114,auVar116);
        auVar114 = vandps_avx(auVar101,auVar216);
        auVar114 = vmaxps_avx(auVar116,auVar114);
        uVar76 = vcmpps_avx512vl(auVar114,auVar100,1);
        bVar12 = (bool)((byte)uVar76 & 1);
        auVar118._0_4_ = (float)((uint)bVar12 * auVar105._0_4_ | (uint)!bVar12 * auVar112._0_4_);
        bVar12 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar118._4_4_ = (float)((uint)bVar12 * auVar105._4_4_ | (uint)!bVar12 * auVar112._4_4_);
        bVar12 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar118._8_4_ = (float)((uint)bVar12 * auVar105._8_4_ | (uint)!bVar12 * auVar112._8_4_);
        bVar12 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar118._12_4_ = (float)((uint)bVar12 * auVar105._12_4_ | (uint)!bVar12 * auVar112._12_4_);
        bVar12 = (bool)((byte)(uVar76 >> 4) & 1);
        auVar118._16_4_ = (float)((uint)bVar12 * auVar105._16_4_ | (uint)!bVar12 * auVar112._16_4_);
        bVar12 = (bool)((byte)(uVar76 >> 5) & 1);
        auVar118._20_4_ = (float)((uint)bVar12 * auVar105._20_4_ | (uint)!bVar12 * auVar112._20_4_);
        bVar12 = (bool)((byte)(uVar76 >> 6) & 1);
        auVar118._24_4_ = (float)((uint)bVar12 * auVar105._24_4_ | (uint)!bVar12 * auVar112._24_4_);
        bVar12 = SUB81(uVar76 >> 7,0);
        auVar118._28_4_ = (uint)bVar12 * auVar105._28_4_ | (uint)!bVar12 * auVar112._28_4_;
        bVar12 = (bool)((byte)uVar76 & 1);
        auVar119._0_4_ = (float)((uint)bVar12 * auVar106._0_4_ | (uint)!bVar12 * auVar111._0_4_);
        bVar12 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar119._4_4_ = (float)((uint)bVar12 * auVar106._4_4_ | (uint)!bVar12 * auVar111._4_4_);
        bVar12 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar119._8_4_ = (float)((uint)bVar12 * auVar106._8_4_ | (uint)!bVar12 * auVar111._8_4_);
        bVar12 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar119._12_4_ = (float)((uint)bVar12 * auVar106._12_4_ | (uint)!bVar12 * auVar111._12_4_);
        bVar12 = (bool)((byte)(uVar76 >> 4) & 1);
        auVar119._16_4_ = (float)((uint)bVar12 * auVar106._16_4_ | (uint)!bVar12 * auVar111._16_4_);
        bVar12 = (bool)((byte)(uVar76 >> 5) & 1);
        auVar119._20_4_ = (float)((uint)bVar12 * auVar106._20_4_ | (uint)!bVar12 * auVar111._20_4_);
        bVar12 = (bool)((byte)(uVar76 >> 6) & 1);
        auVar119._24_4_ = (float)((uint)bVar12 * auVar106._24_4_ | (uint)!bVar12 * auVar111._24_4_);
        bVar12 = SUB81(uVar76 >> 7,0);
        auVar119._28_4_ = (uint)bVar12 * auVar106._28_4_ | (uint)!bVar12 * auVar111._28_4_;
        auVar98 = vxorps_avx512vl(auVar96,auVar96);
        auVar225 = ZEXT1664(auVar98);
        auVar114 = vfmadd213ps_avx512vl(auVar115,auVar115,ZEXT1632(auVar98));
        auVar96 = vfmadd231ps_fma(auVar114,auVar117,auVar117);
        auVar116 = vrsqrt14ps_avx512vl(ZEXT1632(auVar96));
        fVar173 = auVar116._0_4_;
        fVar177 = auVar116._4_4_;
        fVar193 = auVar116._8_4_;
        fVar194 = auVar116._12_4_;
        fVar195 = auVar116._16_4_;
        fVar176 = auVar116._20_4_;
        fVar86 = auVar116._24_4_;
        auVar114._4_4_ = fVar177 * fVar177 * fVar177 * auVar96._4_4_ * -0.5;
        auVar114._0_4_ = fVar173 * fVar173 * fVar173 * auVar96._0_4_ * -0.5;
        auVar114._8_4_ = fVar193 * fVar193 * fVar193 * auVar96._8_4_ * -0.5;
        auVar114._12_4_ = fVar194 * fVar194 * fVar194 * auVar96._12_4_ * -0.5;
        auVar114._16_4_ = fVar195 * fVar195 * fVar195 * -0.0;
        auVar114._20_4_ = fVar176 * fVar176 * fVar176 * -0.0;
        auVar114._24_4_ = fVar86 * fVar86 * fVar86 * -0.0;
        auVar114._28_4_ = auVar101._28_4_;
        auVar99 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar114 = vfmadd231ps_avx512vl(auVar114,auVar99,auVar116);
        auVar112._4_4_ = auVar117._4_4_ * auVar114._4_4_;
        auVar112._0_4_ = auVar117._0_4_ * auVar114._0_4_;
        auVar112._8_4_ = auVar117._8_4_ * auVar114._8_4_;
        auVar112._12_4_ = auVar117._12_4_ * auVar114._12_4_;
        auVar112._16_4_ = auVar117._16_4_ * auVar114._16_4_;
        auVar112._20_4_ = auVar117._20_4_ * auVar114._20_4_;
        auVar112._24_4_ = auVar117._24_4_ * auVar114._24_4_;
        auVar112._28_4_ = 0;
        auVar111._4_4_ = auVar114._4_4_ * -auVar115._4_4_;
        auVar111._0_4_ = auVar114._0_4_ * -auVar115._0_4_;
        auVar111._8_4_ = auVar114._8_4_ * -auVar115._8_4_;
        auVar111._12_4_ = auVar114._12_4_ * -auVar115._12_4_;
        auVar111._16_4_ = auVar114._16_4_ * -auVar115._16_4_;
        auVar111._20_4_ = auVar114._20_4_ * -auVar115._20_4_;
        auVar111._24_4_ = auVar114._24_4_ * -auVar115._24_4_;
        auVar111._28_4_ = auVar117._28_4_;
        auVar114 = vmulps_avx512vl(auVar114,ZEXT1632(auVar98));
        auVar105 = ZEXT1632(auVar98);
        auVar116 = vfmadd213ps_avx512vl(auVar118,auVar118,auVar105);
        auVar96 = vfmadd231ps_fma(auVar116,auVar119,auVar119);
        auVar116 = vrsqrt14ps_avx512vl(ZEXT1632(auVar96));
        fVar173 = auVar116._0_4_;
        fVar177 = auVar116._4_4_;
        fVar193 = auVar116._8_4_;
        fVar194 = auVar116._12_4_;
        fVar195 = auVar116._16_4_;
        fVar176 = auVar116._20_4_;
        fVar86 = auVar116._24_4_;
        auVar100._4_4_ = fVar177 * fVar177 * fVar177 * auVar96._4_4_ * -0.5;
        auVar100._0_4_ = fVar173 * fVar173 * fVar173 * auVar96._0_4_ * -0.5;
        auVar100._8_4_ = fVar193 * fVar193 * fVar193 * auVar96._8_4_ * -0.5;
        auVar100._12_4_ = fVar194 * fVar194 * fVar194 * auVar96._12_4_ * -0.5;
        auVar100._16_4_ = fVar195 * fVar195 * fVar195 * -0.0;
        auVar100._20_4_ = fVar176 * fVar176 * fVar176 * -0.0;
        auVar100._24_4_ = fVar86 * fVar86 * fVar86 * -0.0;
        auVar100._28_4_ = 0;
        auVar99 = vfmadd231ps_avx512vl(auVar100,auVar99,auVar116);
        auVar110._4_4_ = auVar119._4_4_ * auVar99._4_4_;
        auVar110._0_4_ = auVar119._0_4_ * auVar99._0_4_;
        auVar110._8_4_ = auVar119._8_4_ * auVar99._8_4_;
        auVar110._12_4_ = auVar119._12_4_ * auVar99._12_4_;
        auVar110._16_4_ = auVar119._16_4_ * auVar99._16_4_;
        auVar110._20_4_ = auVar119._20_4_ * auVar99._20_4_;
        auVar110._24_4_ = auVar119._24_4_ * auVar99._24_4_;
        auVar110._28_4_ = auVar116._28_4_;
        auVar101._4_4_ = -auVar118._4_4_ * auVar99._4_4_;
        auVar101._0_4_ = -auVar118._0_4_ * auVar99._0_4_;
        auVar101._8_4_ = -auVar118._8_4_ * auVar99._8_4_;
        auVar101._12_4_ = -auVar118._12_4_ * auVar99._12_4_;
        auVar101._16_4_ = -auVar118._16_4_ * auVar99._16_4_;
        auVar101._20_4_ = -auVar118._20_4_ * auVar99._20_4_;
        auVar101._24_4_ = -auVar118._24_4_ * auVar99._24_4_;
        auVar101._28_4_ = auVar118._28_4_ ^ 0x80000000;
        auVar116 = vmulps_avx512vl(auVar99,auVar105);
        auVar96 = vfmadd213ps_fma(auVar112,auVar107,auVar102);
        auVar95 = vfmadd213ps_fma(auVar111,auVar107,auVar103);
        auVar99 = vfmadd213ps_avx512vl(auVar114,auVar107,auVar113);
        auVar100 = vfmadd213ps_avx512vl(auVar110,ZEXT1632(auVar91),ZEXT1632(auVar20));
        auVar88 = vfnmadd213ps_fma(auVar112,auVar107,auVar102);
        auVar102 = ZEXT1632(auVar91);
        auVar89 = vfmadd213ps_fma(auVar101,auVar102,ZEXT1632(auVar21));
        auVar97 = vfnmadd213ps_fma(auVar111,auVar107,auVar103);
        auVar224 = vfmadd213ps_fma(auVar116,auVar102,auVar109);
        auVar112 = vfnmadd231ps_avx512vl(auVar113,auVar107,auVar114);
        auVar20 = vfnmadd213ps_fma(auVar110,auVar102,ZEXT1632(auVar20));
        auVar21 = vfnmadd213ps_fma(auVar101,auVar102,ZEXT1632(auVar21));
        auVar28 = vfnmadd231ps_fma(auVar109,ZEXT1632(auVar91),auVar116);
        auVar116 = vsubps_avx512vl(auVar100,ZEXT1632(auVar88));
        auVar114 = vsubps_avx(ZEXT1632(auVar89),ZEXT1632(auVar97));
        auVar111 = vsubps_avx512vl(ZEXT1632(auVar224),auVar112);
        auVar110 = vmulps_avx512vl(auVar114,auVar112);
        auVar19 = vfmsub231ps_fma(auVar110,ZEXT1632(auVar97),auVar111);
        auVar102._4_4_ = auVar88._4_4_ * auVar111._4_4_;
        auVar102._0_4_ = auVar88._0_4_ * auVar111._0_4_;
        auVar102._8_4_ = auVar88._8_4_ * auVar111._8_4_;
        auVar102._12_4_ = auVar88._12_4_ * auVar111._12_4_;
        auVar102._16_4_ = auVar111._16_4_ * 0.0;
        auVar102._20_4_ = auVar111._20_4_ * 0.0;
        auVar102._24_4_ = auVar111._24_4_ * 0.0;
        auVar102._28_4_ = auVar111._28_4_;
        auVar111 = vfmsub231ps_avx512vl(auVar102,auVar112,auVar116);
        auVar103._4_4_ = auVar97._4_4_ * auVar116._4_4_;
        auVar103._0_4_ = auVar97._0_4_ * auVar116._0_4_;
        auVar103._8_4_ = auVar97._8_4_ * auVar116._8_4_;
        auVar103._12_4_ = auVar97._12_4_ * auVar116._12_4_;
        auVar103._16_4_ = auVar116._16_4_ * 0.0;
        auVar103._20_4_ = auVar116._20_4_ * 0.0;
        auVar103._24_4_ = auVar116._24_4_ * 0.0;
        auVar103._28_4_ = auVar116._28_4_;
        auVar90 = vfmsub231ps_fma(auVar103,ZEXT1632(auVar88),auVar114);
        auVar114 = vfmadd231ps_avx512vl(ZEXT1632(auVar90),auVar105,auVar111);
        auVar114 = vfmadd231ps_avx512vl(auVar114,auVar105,ZEXT1632(auVar19));
        auVar115 = ZEXT1632(auVar98);
        uVar76 = vcmpps_avx512vl(auVar114,auVar115,2);
        bVar75 = (byte)uVar76;
        fVar86 = (float)((uint)(bVar75 & 1) * auVar96._0_4_ |
                        (uint)!(bool)(bVar75 & 1) * auVar20._0_4_);
        bVar12 = (bool)((byte)(uVar76 >> 1) & 1);
        fVar138 = (float)((uint)bVar12 * auVar96._4_4_ | (uint)!bVar12 * auVar20._4_4_);
        bVar12 = (bool)((byte)(uVar76 >> 2) & 1);
        fVar140 = (float)((uint)bVar12 * auVar96._8_4_ | (uint)!bVar12 * auVar20._8_4_);
        bVar12 = (bool)((byte)(uVar76 >> 3) & 1);
        fVar142 = (float)((uint)bVar12 * auVar96._12_4_ | (uint)!bVar12 * auVar20._12_4_);
        auVar110 = ZEXT1632(CONCAT412(fVar142,CONCAT48(fVar140,CONCAT44(fVar138,fVar86))));
        fVar87 = (float)((uint)(bVar75 & 1) * auVar95._0_4_ |
                        (uint)!(bool)(bVar75 & 1) * auVar21._0_4_);
        bVar12 = (bool)((byte)(uVar76 >> 1) & 1);
        fVar139 = (float)((uint)bVar12 * auVar95._4_4_ | (uint)!bVar12 * auVar21._4_4_);
        bVar12 = (bool)((byte)(uVar76 >> 2) & 1);
        fVar141 = (float)((uint)bVar12 * auVar95._8_4_ | (uint)!bVar12 * auVar21._8_4_);
        bVar12 = (bool)((byte)(uVar76 >> 3) & 1);
        fVar143 = (float)((uint)bVar12 * auVar95._12_4_ | (uint)!bVar12 * auVar21._12_4_);
        auVar101 = ZEXT1632(CONCAT412(fVar143,CONCAT48(fVar141,CONCAT44(fVar139,fVar87))));
        auVar113._0_4_ =
             (float)((uint)(bVar75 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar75 & 1) * auVar28._0_4_)
        ;
        bVar12 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar113._4_4_ = (float)((uint)bVar12 * auVar99._4_4_ | (uint)!bVar12 * auVar28._4_4_);
        bVar12 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar113._8_4_ = (float)((uint)bVar12 * auVar99._8_4_ | (uint)!bVar12 * auVar28._8_4_);
        bVar12 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar113._12_4_ = (float)((uint)bVar12 * auVar99._12_4_ | (uint)!bVar12 * auVar28._12_4_);
        fVar177 = (float)((uint)((byte)(uVar76 >> 4) & 1) * auVar99._16_4_);
        auVar113._16_4_ = fVar177;
        fVar173 = (float)((uint)((byte)(uVar76 >> 5) & 1) * auVar99._20_4_);
        auVar113._20_4_ = fVar173;
        fVar193 = (float)((uint)((byte)(uVar76 >> 6) & 1) * auVar99._24_4_);
        auVar113._24_4_ = fVar193;
        iVar1 = (uint)(byte)(uVar76 >> 7) * auVar99._28_4_;
        auVar113._28_4_ = iVar1;
        auVar116 = vblendmps_avx512vl(ZEXT1632(auVar88),auVar100);
        auVar120._0_4_ =
             (uint)(bVar75 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar75 & 1) * auVar19._0_4_;
        bVar12 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar120._4_4_ = (uint)bVar12 * auVar116._4_4_ | (uint)!bVar12 * auVar19._4_4_;
        bVar12 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar120._8_4_ = (uint)bVar12 * auVar116._8_4_ | (uint)!bVar12 * auVar19._8_4_;
        bVar12 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar120._12_4_ = (uint)bVar12 * auVar116._12_4_ | (uint)!bVar12 * auVar19._12_4_;
        auVar120._16_4_ = (uint)((byte)(uVar76 >> 4) & 1) * auVar116._16_4_;
        auVar120._20_4_ = (uint)((byte)(uVar76 >> 5) & 1) * auVar116._20_4_;
        auVar120._24_4_ = (uint)((byte)(uVar76 >> 6) & 1) * auVar116._24_4_;
        auVar120._28_4_ = (uint)(byte)(uVar76 >> 7) * auVar116._28_4_;
        auVar116 = vblendmps_avx512vl(ZEXT1632(auVar97),ZEXT1632(auVar89));
        auVar121._0_4_ =
             (float)((uint)(bVar75 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar75 & 1) * auVar95._0_4_
                    );
        bVar12 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar121._4_4_ = (float)((uint)bVar12 * auVar116._4_4_ | (uint)!bVar12 * auVar95._4_4_);
        bVar12 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar121._8_4_ = (float)((uint)bVar12 * auVar116._8_4_ | (uint)!bVar12 * auVar95._8_4_);
        bVar12 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar121._12_4_ = (float)((uint)bVar12 * auVar116._12_4_ | (uint)!bVar12 * auVar95._12_4_);
        fVar194 = (float)((uint)((byte)(uVar76 >> 4) & 1) * auVar116._16_4_);
        auVar121._16_4_ = fVar194;
        fVar195 = (float)((uint)((byte)(uVar76 >> 5) & 1) * auVar116._20_4_);
        auVar121._20_4_ = fVar195;
        fVar176 = (float)((uint)((byte)(uVar76 >> 6) & 1) * auVar116._24_4_);
        auVar121._24_4_ = fVar176;
        auVar121._28_4_ = (uint)(byte)(uVar76 >> 7) * auVar116._28_4_;
        auVar116 = vblendmps_avx512vl(auVar112,ZEXT1632(auVar224));
        auVar122._0_4_ =
             (float)((uint)(bVar75 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar75 & 1) * auVar99._0_4_
                    );
        bVar12 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar122._4_4_ = (float)((uint)bVar12 * auVar116._4_4_ | (uint)!bVar12 * auVar99._4_4_);
        bVar12 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar122._8_4_ = (float)((uint)bVar12 * auVar116._8_4_ | (uint)!bVar12 * auVar99._8_4_);
        bVar12 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar122._12_4_ = (float)((uint)bVar12 * auVar116._12_4_ | (uint)!bVar12 * auVar99._12_4_);
        bVar12 = (bool)((byte)(uVar76 >> 4) & 1);
        auVar122._16_4_ = (float)((uint)bVar12 * auVar116._16_4_ | (uint)!bVar12 * auVar99._16_4_);
        bVar12 = (bool)((byte)(uVar76 >> 5) & 1);
        auVar122._20_4_ = (float)((uint)bVar12 * auVar116._20_4_ | (uint)!bVar12 * auVar99._20_4_);
        bVar12 = (bool)((byte)(uVar76 >> 6) & 1);
        auVar122._24_4_ = (float)((uint)bVar12 * auVar116._24_4_ | (uint)!bVar12 * auVar99._24_4_);
        bVar12 = SUB81(uVar76 >> 7,0);
        auVar122._28_4_ = (uint)bVar12 * auVar116._28_4_ | (uint)!bVar12 * auVar99._28_4_;
        auVar123._0_4_ =
             (uint)(bVar75 & 1) * (int)auVar88._0_4_ | (uint)!(bool)(bVar75 & 1) * auVar100._0_4_;
        bVar12 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar123._4_4_ = (uint)bVar12 * (int)auVar88._4_4_ | (uint)!bVar12 * auVar100._4_4_;
        bVar12 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar123._8_4_ = (uint)bVar12 * (int)auVar88._8_4_ | (uint)!bVar12 * auVar100._8_4_;
        bVar12 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar123._12_4_ = (uint)bVar12 * (int)auVar88._12_4_ | (uint)!bVar12 * auVar100._12_4_;
        auVar123._16_4_ = (uint)!(bool)((byte)(uVar76 >> 4) & 1) * auVar100._16_4_;
        auVar123._20_4_ = (uint)!(bool)((byte)(uVar76 >> 5) & 1) * auVar100._20_4_;
        auVar123._24_4_ = (uint)!(bool)((byte)(uVar76 >> 6) & 1) * auVar100._24_4_;
        auVar123._28_4_ = (uint)!SUB81(uVar76 >> 7,0) * auVar100._28_4_;
        bVar12 = (bool)((byte)(uVar76 >> 1) & 1);
        bVar14 = (bool)((byte)(uVar76 >> 2) & 1);
        bVar15 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar124._0_4_ =
             (uint)(bVar75 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar75 & 1) * auVar224._0_4_;
        bVar13 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar124._4_4_ = (uint)bVar13 * auVar112._4_4_ | (uint)!bVar13 * auVar224._4_4_;
        bVar13 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar124._8_4_ = (uint)bVar13 * auVar112._8_4_ | (uint)!bVar13 * auVar224._8_4_;
        bVar13 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar124._12_4_ = (uint)bVar13 * auVar112._12_4_ | (uint)!bVar13 * auVar224._12_4_;
        auVar124._16_4_ = (uint)((byte)(uVar76 >> 4) & 1) * auVar112._16_4_;
        auVar124._20_4_ = (uint)((byte)(uVar76 >> 5) & 1) * auVar112._20_4_;
        auVar124._24_4_ = (uint)((byte)(uVar76 >> 6) & 1) * auVar112._24_4_;
        iVar2 = (uint)(byte)(uVar76 >> 7) * auVar112._28_4_;
        auVar124._28_4_ = iVar2;
        auVar102 = vsubps_avx512vl(auVar123,auVar110);
        auVar116 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar15 * (int)auVar97._12_4_ |
                                                 (uint)!bVar15 * auVar89._12_4_,
                                                 CONCAT48((uint)bVar14 * (int)auVar97._8_4_ |
                                                          (uint)!bVar14 * auVar89._8_4_,
                                                          CONCAT44((uint)bVar12 * (int)auVar97._4_4_
                                                                   | (uint)!bVar12 * auVar89._4_4_,
                                                                   (uint)(bVar75 & 1) *
                                                                   (int)auVar97._0_4_ |
                                                                   (uint)!(bool)(bVar75 & 1) *
                                                                   auVar89._0_4_)))),auVar101);
        auVar112 = vsubps_avx(auVar124,auVar113);
        auVar111 = vsubps_avx(auVar110,auVar120);
        auVar99 = vsubps_avx(auVar101,auVar121);
        auVar100 = vsubps_avx(auVar113,auVar122);
        auVar105._4_4_ = auVar112._4_4_ * fVar138;
        auVar105._0_4_ = auVar112._0_4_ * fVar86;
        auVar105._8_4_ = auVar112._8_4_ * fVar140;
        auVar105._12_4_ = auVar112._12_4_ * fVar142;
        auVar105._16_4_ = auVar112._16_4_ * 0.0;
        auVar105._20_4_ = auVar112._20_4_ * 0.0;
        auVar105._24_4_ = auVar112._24_4_ * 0.0;
        auVar105._28_4_ = iVar2;
        auVar96 = vfmsub231ps_fma(auVar105,auVar113,auVar102);
        auVar106._4_4_ = fVar139 * auVar102._4_4_;
        auVar106._0_4_ = fVar87 * auVar102._0_4_;
        auVar106._8_4_ = fVar141 * auVar102._8_4_;
        auVar106._12_4_ = fVar143 * auVar102._12_4_;
        auVar106._16_4_ = auVar102._16_4_ * 0.0;
        auVar106._20_4_ = auVar102._20_4_ * 0.0;
        auVar106._24_4_ = auVar102._24_4_ * 0.0;
        auVar106._28_4_ = auVar114._28_4_;
        auVar95 = vfmsub231ps_fma(auVar106,auVar110,auVar116);
        auVar114 = vfmadd231ps_avx512vl(ZEXT1632(auVar95),auVar115,ZEXT1632(auVar96));
        auVar189._0_4_ = auVar116._0_4_ * auVar113._0_4_;
        auVar189._4_4_ = auVar116._4_4_ * auVar113._4_4_;
        auVar189._8_4_ = auVar116._8_4_ * auVar113._8_4_;
        auVar189._12_4_ = auVar116._12_4_ * auVar113._12_4_;
        auVar189._16_4_ = auVar116._16_4_ * fVar177;
        auVar189._20_4_ = auVar116._20_4_ * fVar173;
        auVar189._24_4_ = auVar116._24_4_ * fVar193;
        auVar189._28_4_ = 0;
        auVar96 = vfmsub231ps_fma(auVar189,auVar101,auVar112);
        auVar103 = vfmadd231ps_avx512vl(auVar114,auVar115,ZEXT1632(auVar96));
        auVar114 = vmulps_avx512vl(auVar100,auVar120);
        auVar114 = vfmsub231ps_avx512vl(auVar114,auVar111,auVar122);
        auVar109._4_4_ = auVar99._4_4_ * auVar122._4_4_;
        auVar109._0_4_ = auVar99._0_4_ * auVar122._0_4_;
        auVar109._8_4_ = auVar99._8_4_ * auVar122._8_4_;
        auVar109._12_4_ = auVar99._12_4_ * auVar122._12_4_;
        auVar109._16_4_ = auVar99._16_4_ * auVar122._16_4_;
        auVar109._20_4_ = auVar99._20_4_ * auVar122._20_4_;
        auVar109._24_4_ = auVar99._24_4_ * auVar122._24_4_;
        auVar109._28_4_ = auVar122._28_4_;
        auVar96 = vfmsub231ps_fma(auVar109,auVar121,auVar100);
        auVar190._0_4_ = auVar121._0_4_ * auVar111._0_4_;
        auVar190._4_4_ = auVar121._4_4_ * auVar111._4_4_;
        auVar190._8_4_ = auVar121._8_4_ * auVar111._8_4_;
        auVar190._12_4_ = auVar121._12_4_ * auVar111._12_4_;
        auVar190._16_4_ = fVar194 * auVar111._16_4_;
        auVar190._20_4_ = fVar195 * auVar111._20_4_;
        auVar190._24_4_ = fVar176 * auVar111._24_4_;
        auVar190._28_4_ = 0;
        auVar95 = vfmsub231ps_fma(auVar190,auVar99,auVar120);
        auVar114 = vfmadd231ps_avx512vl(ZEXT1632(auVar95),auVar115,auVar114);
        auVar105 = vfmadd231ps_avx512vl(auVar114,auVar115,ZEXT1632(auVar96));
        auVar114 = vmaxps_avx(auVar103,auVar105);
        uVar146 = vcmpps_avx512vl(auVar114,auVar115,2);
        bVar85 = bVar85 & (byte)uVar146;
        auVar221 = ZEXT3264(local_360);
        auVar222 = ZEXT3264(local_340);
        auVar223 = ZEXT3264(local_380);
        auVar219 = ZEXT3264(local_540);
        auVar218 = ZEXT3264(local_560);
        auVar214 = ZEXT1664(_local_520);
        if (bVar85 == 0) {
          bVar85 = 0;
        }
        else {
          auVar43._4_4_ = auVar100._4_4_ * auVar116._4_4_;
          auVar43._0_4_ = auVar100._0_4_ * auVar116._0_4_;
          auVar43._8_4_ = auVar100._8_4_ * auVar116._8_4_;
          auVar43._12_4_ = auVar100._12_4_ * auVar116._12_4_;
          auVar43._16_4_ = auVar100._16_4_ * auVar116._16_4_;
          auVar43._20_4_ = auVar100._20_4_ * auVar116._20_4_;
          auVar43._24_4_ = auVar100._24_4_ * auVar116._24_4_;
          auVar43._28_4_ = auVar114._28_4_;
          auVar89 = vfmsub231ps_fma(auVar43,auVar99,auVar112);
          auVar44._4_4_ = auVar112._4_4_ * auVar111._4_4_;
          auVar44._0_4_ = auVar112._0_4_ * auVar111._0_4_;
          auVar44._8_4_ = auVar112._8_4_ * auVar111._8_4_;
          auVar44._12_4_ = auVar112._12_4_ * auVar111._12_4_;
          auVar44._16_4_ = auVar112._16_4_ * auVar111._16_4_;
          auVar44._20_4_ = auVar112._20_4_ * auVar111._20_4_;
          auVar44._24_4_ = auVar112._24_4_ * auVar111._24_4_;
          auVar44._28_4_ = auVar112._28_4_;
          auVar95 = vfmsub231ps_fma(auVar44,auVar102,auVar100);
          auVar45._4_4_ = auVar99._4_4_ * auVar102._4_4_;
          auVar45._0_4_ = auVar99._0_4_ * auVar102._0_4_;
          auVar45._8_4_ = auVar99._8_4_ * auVar102._8_4_;
          auVar45._12_4_ = auVar99._12_4_ * auVar102._12_4_;
          auVar45._16_4_ = auVar99._16_4_ * auVar102._16_4_;
          auVar45._20_4_ = auVar99._20_4_ * auVar102._20_4_;
          auVar45._24_4_ = auVar99._24_4_ * auVar102._24_4_;
          auVar45._28_4_ = auVar99._28_4_;
          auVar224 = vfmsub231ps_fma(auVar45,auVar111,auVar116);
          auVar96 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar95),ZEXT1632(auVar224));
          auVar114 = vfmadd231ps_avx512vl(ZEXT1632(auVar96),ZEXT1632(auVar89),auVar115);
          auVar116 = vrcp14ps_avx512vl(auVar114);
          auVar34._8_4_ = 0x3f800000;
          auVar34._0_8_ = &DAT_3f8000003f800000;
          auVar34._12_4_ = 0x3f800000;
          auVar34._16_4_ = 0x3f800000;
          auVar34._20_4_ = 0x3f800000;
          auVar34._24_4_ = 0x3f800000;
          auVar34._28_4_ = 0x3f800000;
          auVar112 = vfnmadd213ps_avx512vl(auVar116,auVar114,auVar34);
          auVar96 = vfmadd132ps_fma(auVar112,auVar116,auVar116);
          auVar46._4_4_ = auVar224._4_4_ * auVar113._4_4_;
          auVar46._0_4_ = auVar224._0_4_ * auVar113._0_4_;
          auVar46._8_4_ = auVar224._8_4_ * auVar113._8_4_;
          auVar46._12_4_ = auVar224._12_4_ * auVar113._12_4_;
          auVar46._16_4_ = fVar177 * 0.0;
          auVar46._20_4_ = fVar173 * 0.0;
          auVar46._24_4_ = fVar193 * 0.0;
          auVar46._28_4_ = iVar1;
          auVar95 = vfmadd231ps_fma(auVar46,auVar101,ZEXT1632(auVar95));
          auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar110,ZEXT1632(auVar89));
          fVar177 = auVar96._0_4_;
          fVar193 = auVar96._4_4_;
          fVar194 = auVar96._8_4_;
          fVar195 = auVar96._12_4_;
          auVar116 = ZEXT1632(CONCAT412(auVar95._12_4_ * fVar195,
                                        CONCAT48(auVar95._8_4_ * fVar194,
                                                 CONCAT44(auVar95._4_4_ * fVar193,
                                                          auVar95._0_4_ * fVar177))));
          auVar204._4_4_ = fVar174;
          auVar204._0_4_ = fVar174;
          auVar204._8_4_ = fVar174;
          auVar204._12_4_ = fVar174;
          auVar204._16_4_ = fVar174;
          auVar204._20_4_ = fVar174;
          auVar204._24_4_ = fVar174;
          auVar204._28_4_ = fVar174;
          uVar146 = vcmpps_avx512vl(auVar204,auVar116,2);
          fVar173 = (ray->super_RayK<1>).tfar;
          auVar35._4_4_ = fVar173;
          auVar35._0_4_ = fVar173;
          auVar35._8_4_ = fVar173;
          auVar35._12_4_ = fVar173;
          auVar35._16_4_ = fVar173;
          auVar35._20_4_ = fVar173;
          auVar35._24_4_ = fVar173;
          auVar35._28_4_ = fVar173;
          uVar24 = vcmpps_avx512vl(auVar116,auVar35,2);
          bVar85 = (byte)uVar146 & (byte)uVar24 & bVar85;
          if (bVar85 != 0) {
            uVar146 = vcmpps_avx512vl(auVar114,auVar115,4);
            if ((bVar85 & (byte)uVar146) != 0) {
              bVar85 = bVar85 & (byte)uVar146;
              fVar173 = auVar103._0_4_ * fVar177;
              fVar176 = auVar103._4_4_ * fVar193;
              auVar47._4_4_ = fVar176;
              auVar47._0_4_ = fVar173;
              fVar86 = auVar103._8_4_ * fVar194;
              auVar47._8_4_ = fVar86;
              fVar87 = auVar103._12_4_ * fVar195;
              auVar47._12_4_ = fVar87;
              fVar138 = auVar103._16_4_ * 0.0;
              auVar47._16_4_ = fVar138;
              fVar139 = auVar103._20_4_ * 0.0;
              auVar47._20_4_ = fVar139;
              fVar140 = auVar103._24_4_ * 0.0;
              auVar47._24_4_ = fVar140;
              auVar47._28_4_ = auVar103._28_4_;
              fVar177 = auVar105._0_4_ * fVar177;
              fVar193 = auVar105._4_4_ * fVar193;
              auVar48._4_4_ = fVar193;
              auVar48._0_4_ = fVar177;
              fVar194 = auVar105._8_4_ * fVar194;
              auVar48._8_4_ = fVar194;
              fVar195 = auVar105._12_4_ * fVar195;
              auVar48._12_4_ = fVar195;
              fVar141 = auVar105._16_4_ * 0.0;
              auVar48._16_4_ = fVar141;
              fVar142 = auVar105._20_4_ * 0.0;
              auVar48._20_4_ = fVar142;
              fVar143 = auVar105._24_4_ * 0.0;
              auVar48._24_4_ = fVar143;
              auVar48._28_4_ = auVar105._28_4_;
              auVar198._8_4_ = 0x3f800000;
              auVar198._0_8_ = &DAT_3f8000003f800000;
              auVar198._12_4_ = 0x3f800000;
              auVar198._16_4_ = 0x3f800000;
              auVar198._20_4_ = 0x3f800000;
              auVar198._24_4_ = 0x3f800000;
              auVar198._28_4_ = 0x3f800000;
              auVar114 = vsubps_avx(auVar198,auVar47);
              local_3a0._0_4_ =
                   (uint)(bVar75 & 1) * (int)fVar173 | (uint)!(bool)(bVar75 & 1) * auVar114._0_4_;
              bVar12 = (bool)((byte)(uVar76 >> 1) & 1);
              local_3a0._4_4_ = (uint)bVar12 * (int)fVar176 | (uint)!bVar12 * auVar114._4_4_;
              bVar12 = (bool)((byte)(uVar76 >> 2) & 1);
              local_3a0._8_4_ = (uint)bVar12 * (int)fVar86 | (uint)!bVar12 * auVar114._8_4_;
              bVar12 = (bool)((byte)(uVar76 >> 3) & 1);
              local_3a0._12_4_ = (uint)bVar12 * (int)fVar87 | (uint)!bVar12 * auVar114._12_4_;
              bVar12 = (bool)((byte)(uVar76 >> 4) & 1);
              local_3a0._16_4_ = (uint)bVar12 * (int)fVar138 | (uint)!bVar12 * auVar114._16_4_;
              bVar12 = (bool)((byte)(uVar76 >> 5) & 1);
              local_3a0._20_4_ = (uint)bVar12 * (int)fVar139 | (uint)!bVar12 * auVar114._20_4_;
              bVar12 = (bool)((byte)(uVar76 >> 6) & 1);
              local_3a0._24_4_ = (uint)bVar12 * (int)fVar140 | (uint)!bVar12 * auVar114._24_4_;
              bVar12 = SUB81(uVar76 >> 7,0);
              local_3a0._28_4_ = (uint)bVar12 * auVar103._28_4_ | (uint)!bVar12 * auVar114._28_4_;
              auVar114 = vsubps_avx(auVar198,auVar48);
              bVar12 = (bool)((byte)(uVar76 >> 1) & 1);
              bVar13 = (bool)((byte)(uVar76 >> 2) & 1);
              bVar14 = (bool)((byte)(uVar76 >> 3) & 1);
              bVar15 = (bool)((byte)(uVar76 >> 4) & 1);
              bVar16 = (bool)((byte)(uVar76 >> 5) & 1);
              bVar17 = (bool)((byte)(uVar76 >> 6) & 1);
              bVar18 = SUB81(uVar76 >> 7,0);
              local_1a0._4_4_ = (uint)bVar12 * (int)fVar193 | (uint)!bVar12 * auVar114._4_4_;
              local_1a0._0_4_ =
                   (uint)(bVar75 & 1) * (int)fVar177 | (uint)!(bool)(bVar75 & 1) * auVar114._0_4_;
              local_1a0._8_4_ = (uint)bVar13 * (int)fVar194 | (uint)!bVar13 * auVar114._8_4_;
              local_1a0._12_4_ = (uint)bVar14 * (int)fVar195 | (uint)!bVar14 * auVar114._12_4_;
              local_1a0._16_4_ = (uint)bVar15 * (int)fVar141 | (uint)!bVar15 * auVar114._16_4_;
              local_1a0._20_4_ = (uint)bVar16 * (int)fVar142 | (uint)!bVar16 * auVar114._20_4_;
              local_1a0._24_4_ = (uint)bVar17 * (int)fVar143 | (uint)!bVar17 * auVar114._24_4_;
              local_1a0._28_4_ = (uint)bVar18 * auVar105._28_4_ | (uint)!bVar18 * auVar114._28_4_;
              local_440 = auVar116;
              goto LAB_01c44ac3;
            }
          }
          bVar85 = 0;
        }
LAB_01c44ac3:
        auVar228 = ZEXT3264(local_4a0);
        auVar227 = ZEXT3264(local_480);
        auVar226 = ZEXT3264(local_460);
        auVar220 = ZEXT3264(auVar104);
        local_5b0 = auVar22;
        _local_510 = auVar23;
        if (bVar85 != 0) {
          auVar114 = vsubps_avx(ZEXT1632(auVar91),auVar107);
          auVar96 = vfmadd213ps_fma(auVar114,local_3a0,auVar107);
          fVar173 = local_5e8->depth_scale;
          auVar107._4_4_ = fVar173;
          auVar107._0_4_ = fVar173;
          auVar107._8_4_ = fVar173;
          auVar107._12_4_ = fVar173;
          auVar107._16_4_ = fVar173;
          auVar107._20_4_ = fVar173;
          auVar107._24_4_ = fVar173;
          auVar107._28_4_ = fVar173;
          auVar114 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar96._12_4_ + auVar96._12_4_,
                                                        CONCAT48(auVar96._8_4_ + auVar96._8_4_,
                                                                 CONCAT44(auVar96._4_4_ +
                                                                          auVar96._4_4_,
                                                                          auVar96._0_4_ +
                                                                          auVar96._0_4_)))),auVar107
                                    );
          uVar146 = vcmpps_avx512vl(local_440,auVar114,6);
          bVar85 = bVar85 & (byte)uVar146;
          if (bVar85 != 0) {
            auVar149._8_4_ = 0xbf800000;
            auVar149._0_8_ = 0xbf800000bf800000;
            auVar149._12_4_ = 0xbf800000;
            auVar149._16_4_ = 0xbf800000;
            auVar149._20_4_ = 0xbf800000;
            auVar149._24_4_ = 0xbf800000;
            auVar149._28_4_ = 0xbf800000;
            auVar36._8_4_ = 0x40000000;
            auVar36._0_8_ = 0x4000000040000000;
            auVar36._12_4_ = 0x40000000;
            auVar36._16_4_ = 0x40000000;
            auVar36._20_4_ = 0x40000000;
            auVar36._24_4_ = 0x40000000;
            auVar36._28_4_ = 0x40000000;
            local_1a0 = vfmadd132ps_avx512vl(local_1a0,auVar149,auVar36);
            local_2e0 = local_3a0;
            auVar114 = local_1a0;
            local_2c0 = local_1a0;
            local_2a0 = local_440;
            local_280 = 0;
            local_27c = iVar8;
            local_270 = local_5b0._0_8_;
            uStack_268 = local_5b0._8_8_;
            local_260 = local_4f0._0_8_;
            uStack_258 = local_4f0._8_8_;
            local_250 = local_500._0_8_;
            uStack_248 = local_500._8_8_;
            local_240 = local_510;
            uStack_238 = uStack_508;
            local_230 = bVar85;
            local_1a0 = auVar114;
            if ((pGVar81->mask & (ray->super_RayK<1>).mask) != 0) {
              fVar173 = 1.0 / auVar108._0_4_;
              local_220[0] = fVar173 * (local_3a0._0_4_ + 0.0);
              local_220[1] = fVar173 * (local_3a0._4_4_ + 1.0);
              local_220[2] = fVar173 * (local_3a0._8_4_ + 2.0);
              local_220[3] = fVar173 * (local_3a0._12_4_ + 3.0);
              fStack_210 = fVar173 * (local_3a0._16_4_ + 4.0);
              fStack_20c = fVar173 * (local_3a0._20_4_ + 5.0);
              fStack_208 = fVar173 * (local_3a0._24_4_ + 6.0);
              fStack_204 = local_3a0._28_4_ + 7.0;
              local_200 = local_1a0._0_8_;
              uStack_1f8 = local_1a0._8_8_;
              uStack_1f0 = local_1a0._16_8_;
              uStack_1e8 = local_1a0._24_8_;
              local_1e0 = local_440;
              auVar150._8_4_ = 0x7f800000;
              auVar150._0_8_ = 0x7f8000007f800000;
              auVar150._12_4_ = 0x7f800000;
              auVar150._16_4_ = 0x7f800000;
              auVar150._20_4_ = 0x7f800000;
              auVar150._24_4_ = 0x7f800000;
              auVar150._28_4_ = 0x7f800000;
              auVar116 = vblendmps_avx512vl(auVar150,local_440);
              auVar125._0_4_ =
                   (uint)(bVar85 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar85 & 1) * 0x7f800000;
              bVar12 = (bool)(bVar85 >> 1 & 1);
              auVar125._4_4_ = (uint)bVar12 * auVar116._4_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(bVar85 >> 2 & 1);
              auVar125._8_4_ = (uint)bVar12 * auVar116._8_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(bVar85 >> 3 & 1);
              auVar125._12_4_ = (uint)bVar12 * auVar116._12_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(bVar85 >> 4 & 1);
              auVar125._16_4_ = (uint)bVar12 * auVar116._16_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(bVar85 >> 5 & 1);
              auVar125._20_4_ = (uint)bVar12 * auVar116._20_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(bVar85 >> 6 & 1);
              auVar125._24_4_ = (uint)bVar12 * auVar116._24_4_ | (uint)!bVar12 * 0x7f800000;
              auVar125._28_4_ =
                   (uint)(bVar85 >> 7) * auVar116._28_4_ | (uint)!(bool)(bVar85 >> 7) * 0x7f800000;
              auVar116 = vshufps_avx(auVar125,auVar125,0xb1);
              auVar116 = vminps_avx(auVar125,auVar116);
              auVar112 = vshufpd_avx(auVar116,auVar116,5);
              auVar116 = vminps_avx(auVar116,auVar112);
              auVar112 = vpermpd_avx2(auVar116,0x4e);
              auVar116 = vminps_avx(auVar116,auVar112);
              uVar146 = vcmpps_avx512vl(auVar125,auVar116,0);
              bVar74 = (byte)uVar146 & bVar85;
              bVar75 = bVar85;
              if (bVar74 != 0) {
                bVar75 = bVar74;
              }
              uVar78 = 0;
              for (uVar77 = (uint)bVar75; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x80000000) {
                uVar78 = uVar78 + 1;
              }
              uVar76 = (ulong)uVar78;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar81->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar173 = local_220[uVar76];
                fVar177 = *(float *)((long)&local_200 + uVar76 * 4);
                fVar193 = 1.0 - fVar173;
                auVar29._8_4_ = 0x80000000;
                auVar29._0_8_ = 0x8000000080000000;
                auVar29._12_4_ = 0x80000000;
                auVar89 = vxorps_avx512vl(ZEXT416((uint)fVar193),auVar29);
                auVar96 = ZEXT416((uint)(fVar173 * fVar193 * 4.0));
                auVar95 = vfnmsub213ss_fma(ZEXT416((uint)fVar173),ZEXT416((uint)fVar173),auVar96);
                auVar96 = vfmadd213ss_fma(ZEXT416((uint)fVar193),ZEXT416((uint)fVar193),auVar96);
                fVar193 = fVar193 * auVar89._0_4_ * 0.5;
                fVar194 = auVar95._0_4_ * 0.5;
                fVar195 = auVar96._0_4_ * 0.5;
                fVar176 = fVar173 * fVar173 * 0.5;
                auVar181._0_4_ = fVar176 * (float)local_510._0_4_;
                auVar181._4_4_ = fVar176 * (float)local_510._4_4_;
                auVar181._8_4_ = fVar176 * (float)uStack_508;
                auVar181._12_4_ = fVar176 * uStack_508._4_4_;
                auVar165._4_4_ = fVar195;
                auVar165._0_4_ = fVar195;
                auVar165._8_4_ = fVar195;
                auVar165._12_4_ = fVar195;
                auVar96 = vfmadd132ps_fma(auVar165,auVar181,local_500);
                auVar182._4_4_ = fVar194;
                auVar182._0_4_ = fVar194;
                auVar182._8_4_ = fVar194;
                auVar182._12_4_ = fVar194;
                auVar96 = vfmadd132ps_fma(auVar182,auVar96,local_4f0);
                auVar166._4_4_ = fVar193;
                auVar166._0_4_ = fVar193;
                auVar166._8_4_ = fVar193;
                auVar166._12_4_ = fVar193;
                (ray->super_RayK<1>).tfar = *(float *)(local_1e0 + uVar76 * 4);
                auVar96 = vfmadd132ps_fma(auVar166,auVar96,local_5b0);
                uVar146 = vmovlps_avx(auVar96);
                *(undefined8 *)&(ray->Ng).field_0 = uVar146;
                fVar193 = (float)vextractps_avx(auVar96,2);
                (ray->Ng).field_0.field_0.z = fVar193;
                ray->u = fVar173;
                ray->v = fVar177;
                ray->primID = uVar79;
                ray->geomID = uVar83;
                ray->instID[0] = context->user->instID[0];
                ray->instPrimID[0] = context->user->instPrimID[0];
              }
              else {
                local_400 = local_4f0._0_4_;
                uStack_3fc = local_4f0._4_4_;
                uStack_3f8 = local_4f0._8_8_;
                local_410 = local_500._0_8_;
                uStack_408 = local_500._8_8_;
                local_500 = auVar26;
                local_4f0 = auVar27;
                local_420 = (float)local_510._0_4_;
                fStack_41c = (float)local_510._4_4_;
                fStack_418 = (float)uStack_508;
                fStack_414 = uStack_508._4_4_;
                do {
                  _local_510 = auVar23;
                  auVar224 = auVar225._0_16_;
                  local_594 = local_220[uVar76];
                  local_590 = *(undefined4 *)((long)&local_200 + uVar76 * 4);
                  fVar178 = (ray->super_RayK<1>).tfar;
                  (ray->super_RayK<1>).tfar = *(float *)(local_1e0 + uVar76 * 4);
                  local_5e0.context = context->user;
                  fVar173 = 1.0 - local_594;
                  auVar33._8_4_ = 0x80000000;
                  auVar33._0_8_ = 0x8000000080000000;
                  auVar33._12_4_ = 0x80000000;
                  auVar89 = vxorps_avx512vl(ZEXT416((uint)fVar173),auVar33);
                  auVar96 = ZEXT416((uint)(local_594 * fVar173 * 4.0));
                  auVar95 = vfnmsub213ss_fma(ZEXT416((uint)local_594),ZEXT416((uint)local_594),
                                             auVar96);
                  auVar96 = vfmadd213ss_fma(ZEXT416((uint)fVar173),ZEXT416((uint)fVar173),auVar96);
                  fVar173 = fVar173 * auVar89._0_4_ * 0.5;
                  fVar177 = auVar95._0_4_ * 0.5;
                  fVar193 = auVar96._0_4_ * 0.5;
                  fVar194 = local_594 * local_594 * 0.5;
                  auVar187._0_4_ = fVar194 * local_420;
                  auVar187._4_4_ = fVar194 * fStack_41c;
                  auVar187._8_4_ = fVar194 * fStack_418;
                  auVar187._12_4_ = fVar194 * fStack_414;
                  auVar171._4_4_ = fVar193;
                  auVar171._0_4_ = fVar193;
                  auVar171._8_4_ = fVar193;
                  auVar171._12_4_ = fVar193;
                  auVar70._8_8_ = uStack_408;
                  auVar70._0_8_ = local_410;
                  auVar96 = vfmadd132ps_fma(auVar171,auVar187,auVar70);
                  auVar188._4_4_ = fVar177;
                  auVar188._0_4_ = fVar177;
                  auVar188._8_4_ = fVar177;
                  auVar188._12_4_ = fVar177;
                  auVar71._4_4_ = uStack_3fc;
                  auVar71._0_4_ = local_400;
                  auVar71._8_8_ = uStack_3f8;
                  auVar96 = vfmadd132ps_fma(auVar188,auVar96,auVar71);
                  auVar172._4_4_ = fVar173;
                  auVar172._0_4_ = fVar173;
                  auVar172._8_4_ = fVar173;
                  auVar172._12_4_ = fVar173;
                  auVar96 = vfmadd132ps_fma(auVar172,auVar96,local_5b0);
                  local_5a0 = vmovlps_avx(auVar96);
                  local_598 = vextractps_avx(auVar96,2);
                  local_58c = (int)local_5f0;
                  local_588 = (int)local_5f8;
                  local_584 = (local_5e0.context)->instID[0];
                  local_580 = (local_5e0.context)->instPrimID[0];
                  local_5fc = -1;
                  local_5e0.valid = &local_5fc;
                  local_5e0.geometryUserPtr = pGVar81->userPtr;
                  local_5e0.ray = (RTCRayN *)ray;
                  local_5e0.hit = (RTCHitN *)&local_5a0;
                  local_5e0.N = 1;
                  local_320 = (undefined4)uVar76;
                  uStack_31c = (undefined4)(uVar76 >> 0x20);
                  if (pGVar81->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01c45dfd:
                    auVar96 = auVar225._0_16_;
                    p_Var11 = context->args->filter;
                    if (p_Var11 != (RTCFilterFunctionN)0x0) {
                      if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                         (((pGVar81->field_8).field_0x2 & 0x40) != 0)) {
                        (*p_Var11)(&local_5e0);
                        uVar76 = CONCAT44(uStack_31c,local_320);
                        auVar214 = ZEXT1664(_local_520);
                        auVar220 = ZEXT3264(local_3c0);
                        auVar228 = ZEXT3264(local_4a0);
                        auVar227 = ZEXT3264(local_480);
                        auVar226 = ZEXT3264(local_460);
                        auVar218 = ZEXT3264(local_560);
                        auVar219 = ZEXT3264(local_540);
                        auVar223 = ZEXT3264(local_380);
                        auVar222 = ZEXT3264(local_340);
                        auVar221 = ZEXT3264(local_360);
                        auVar96 = vxorps_avx512vl(auVar96,auVar96);
                        auVar225 = ZEXT1664(auVar96);
                        fVar174 = local_3e0;
                      }
                      if (*local_5e0.valid == 0) goto LAB_01c45f09;
                    }
                    (((Vec3f *)((long)local_5e0.ray + 0x30))->field_0).components[0] =
                         *(float *)local_5e0.hit;
                    (((Vec3f *)((long)local_5e0.ray + 0x30))->field_0).field_0.y =
                         *(float *)(local_5e0.hit + 4);
                    (((Vec3f *)((long)local_5e0.ray + 0x30))->field_0).field_0.z =
                         *(float *)(local_5e0.hit + 8);
                    *(float *)((long)local_5e0.ray + 0x3c) = *(float *)(local_5e0.hit + 0xc);
                    *(float *)((long)local_5e0.ray + 0x40) = *(float *)(local_5e0.hit + 0x10);
                    *(float *)((long)local_5e0.ray + 0x44) = *(float *)(local_5e0.hit + 0x14);
                    *(float *)((long)local_5e0.ray + 0x48) = *(float *)(local_5e0.hit + 0x18);
                    *(float *)((long)local_5e0.ray + 0x4c) = *(float *)(local_5e0.hit + 0x1c);
                    *(float *)((long)local_5e0.ray + 0x50) = *(float *)(local_5e0.hit + 0x20);
                  }
                  else {
                    (*pGVar81->intersectionFilterN)(&local_5e0);
                    uVar76 = CONCAT44(uStack_31c,local_320);
                    auVar214 = ZEXT1664(_local_520);
                    auVar220 = ZEXT3264(local_3c0);
                    auVar228 = ZEXT3264(local_4a0);
                    auVar227 = ZEXT3264(local_480);
                    auVar226 = ZEXT3264(local_460);
                    auVar218 = ZEXT3264(local_560);
                    auVar219 = ZEXT3264(local_540);
                    auVar223 = ZEXT3264(local_380);
                    auVar222 = ZEXT3264(local_340);
                    auVar221 = ZEXT3264(local_360);
                    auVar96 = vxorps_avx512vl(auVar224,auVar224);
                    auVar225 = ZEXT1664(auVar96);
                    fVar174 = local_3e0;
                    if (*local_5e0.valid != 0) goto LAB_01c45dfd;
LAB_01c45f09:
                    (ray->super_RayK<1>).tfar = fVar178;
                  }
                  fVar178 = auVar214._0_4_;
                  auVar104 = auVar220._0_32_;
                  bVar75 = ~(byte)(1 << ((uint)uVar76 & 0x1f)) & bVar85;
                  fVar173 = (ray->super_RayK<1>).tfar;
                  auVar42._4_4_ = fVar173;
                  auVar42._0_4_ = fVar173;
                  auVar42._8_4_ = fVar173;
                  auVar42._12_4_ = fVar173;
                  auVar42._16_4_ = fVar173;
                  auVar42._20_4_ = fVar173;
                  auVar42._24_4_ = fVar173;
                  auVar42._28_4_ = fVar173;
                  uVar146 = vcmpps_avx512vl(local_440,auVar42,2);
                  bVar85 = bVar75 & (byte)uVar146;
                  if ((bVar75 & (byte)uVar146) != 0) {
                    auVar154._8_4_ = 0x7f800000;
                    auVar154._0_8_ = 0x7f8000007f800000;
                    auVar154._12_4_ = 0x7f800000;
                    auVar154._16_4_ = 0x7f800000;
                    auVar154._20_4_ = 0x7f800000;
                    auVar154._24_4_ = 0x7f800000;
                    auVar154._28_4_ = 0x7f800000;
                    auVar114 = vblendmps_avx512vl(auVar154,local_440);
                    auVar137._0_4_ =
                         (uint)(bVar85 & 1) * auVar114._0_4_ |
                         (uint)!(bool)(bVar85 & 1) * 0x7f800000;
                    bVar12 = (bool)(bVar85 >> 1 & 1);
                    auVar137._4_4_ = (uint)bVar12 * auVar114._4_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)(bVar85 >> 2 & 1);
                    auVar137._8_4_ = (uint)bVar12 * auVar114._8_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)(bVar85 >> 3 & 1);
                    auVar137._12_4_ = (uint)bVar12 * auVar114._12_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)(bVar85 >> 4 & 1);
                    auVar137._16_4_ = (uint)bVar12 * auVar114._16_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)(bVar85 >> 5 & 1);
                    auVar137._20_4_ = (uint)bVar12 * auVar114._20_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)(bVar85 >> 6 & 1);
                    auVar137._24_4_ = (uint)bVar12 * auVar114._24_4_ | (uint)!bVar12 * 0x7f800000;
                    auVar137._28_4_ =
                         (uint)(bVar85 >> 7) * auVar114._28_4_ |
                         (uint)!(bool)(bVar85 >> 7) * 0x7f800000;
                    auVar114 = vshufps_avx(auVar137,auVar137,0xb1);
                    auVar114 = vminps_avx(auVar137,auVar114);
                    auVar116 = vshufpd_avx(auVar114,auVar114,5);
                    auVar114 = vminps_avx(auVar114,auVar116);
                    auVar116 = vpermpd_avx2(auVar114,0x4e);
                    auVar114 = vminps_avx(auVar114,auVar116);
                    uVar146 = vcmpps_avx512vl(auVar137,auVar114,0);
                    bVar74 = (byte)uVar146 & bVar85;
                    bVar75 = bVar85;
                    if (bVar74 != 0) {
                      bVar75 = bVar74;
                    }
                    uVar83 = 0;
                    for (uVar79 = (uint)bVar75; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x80000000
                        ) {
                      uVar83 = uVar83 + 1;
                    }
                    uVar76 = (ulong)uVar83;
                  }
                  auVar23 = _local_510;
                  auVar26 = local_500;
                  auVar27 = local_4f0;
                } while (bVar85 != 0);
              }
            }
          }
        }
      }
      local_4f0 = auVar27;
      local_500 = auVar26;
      if (8 < iVar8) {
        auVar114 = vpbroadcastd_avx512vl();
        auVar214 = ZEXT3264(auVar114);
        local_3e0 = fVar178;
        fStack_3dc = fVar178;
        fStack_3d8 = fVar178;
        fStack_3d4 = fVar178;
        fStack_3d0 = fVar178;
        fStack_3cc = fVar178;
        fStack_3c8 = fVar178;
        fStack_3c4 = fVar178;
        local_320 = fVar174;
        uStack_31c = fVar174;
        uStack_318 = fVar174;
        uStack_314 = fVar174;
        uStack_310 = fVar174;
        uStack_30c = fVar174;
        uStack_308 = fVar174;
        uStack_304 = fVar174;
        local_300._4_4_ = 1.0 / (float)local_300._0_4_;
        local_300._0_4_ = local_300._4_4_;
        fStack_2f8 = (float)local_300._4_4_;
        fStack_2f4 = (float)local_300._4_4_;
        fStack_2f0 = (float)local_300._4_4_;
        fStack_2ec = (float)local_300._4_4_;
        fStack_2e8 = (float)local_300._4_4_;
        fStack_2e4 = (float)local_300._4_4_;
        lVar82 = 8;
        local_3c0 = auVar104;
        do {
          auVar114 = vpbroadcastd_avx512vl();
          auVar99 = vpor_avx2(auVar114,_DAT_0205a920);
          uVar24 = vpcmpgtd_avx512vl(auVar214._0_32_,auVar99);
          auVar114 = *(undefined1 (*) [32])(bspline_basis0 + lVar82 * 4 + lVar25);
          auVar116 = *(undefined1 (*) [32])(lVar25 + 0x222bfac + lVar82 * 4);
          auVar112 = *(undefined1 (*) [32])(lVar25 + 0x222c430 + lVar82 * 4);
          auVar111 = *(undefined1 (*) [32])(lVar25 + 0x222c8b4 + lVar82 * 4);
          local_480 = auVar227._0_32_;
          auVar100 = vmulps_avx512vl(local_480,auVar111);
          local_4a0 = auVar228._0_32_;
          auVar110 = vmulps_avx512vl(local_4a0,auVar111);
          auVar49._4_4_ = auVar111._4_4_ * (float)local_e0._4_4_;
          auVar49._0_4_ = auVar111._0_4_ * (float)local_e0._0_4_;
          auVar49._8_4_ = auVar111._8_4_ * fStack_d8;
          auVar49._12_4_ = auVar111._12_4_ * fStack_d4;
          auVar49._16_4_ = auVar111._16_4_ * fStack_d0;
          auVar49._20_4_ = auVar111._20_4_ * fStack_cc;
          auVar49._24_4_ = auVar111._24_4_ * fStack_c8;
          auVar49._28_4_ = auVar99._28_4_;
          auVar115 = auVar218._0_32_;
          auVar99 = vfmadd231ps_avx512vl(auVar100,auVar112,auVar115);
          local_460 = auVar226._0_32_;
          auVar100 = vfmadd231ps_avx512vl(auVar110,auVar112,local_460);
          auVar110 = vfmadd231ps_avx512vl(auVar49,auVar112,local_c0);
          auVar119 = auVar223._0_32_;
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar116,auVar119);
          auVar117 = auVar219._0_32_;
          auVar100 = vfmadd231ps_avx512vl(auVar100,auVar116,auVar117);
          auVar96 = vfmadd231ps_fma(auVar110,auVar116,local_a0);
          auVar118 = auVar221._0_32_;
          auVar103 = vfmadd231ps_avx512vl(auVar99,auVar114,auVar118);
          local_340 = auVar222._0_32_;
          auVar105 = vfmadd231ps_avx512vl(auVar100,auVar114,local_340);
          auVar99 = *(undefined1 (*) [32])(bspline_basis1 + lVar82 * 4 + lVar25);
          auVar100 = *(undefined1 (*) [32])(lVar25 + 0x222e3cc + lVar82 * 4);
          auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar114,local_80);
          auVar110 = *(undefined1 (*) [32])(lVar25 + 0x222e850 + lVar82 * 4);
          auVar101 = *(undefined1 (*) [32])(lVar25 + 0x222ecd4 + lVar82 * 4);
          auVar104 = vmulps_avx512vl(local_480,auVar101);
          auVar102 = vmulps_avx512vl(local_4a0,auVar101);
          auVar50._4_4_ = auVar101._4_4_ * (float)local_e0._4_4_;
          auVar50._0_4_ = auVar101._0_4_ * (float)local_e0._0_4_;
          auVar50._8_4_ = auVar101._8_4_ * fStack_d8;
          auVar50._12_4_ = auVar101._12_4_ * fStack_d4;
          auVar50._16_4_ = auVar101._16_4_ * fStack_d0;
          auVar50._20_4_ = auVar101._20_4_ * fStack_cc;
          auVar50._24_4_ = auVar101._24_4_ * fStack_c8;
          auVar50._28_4_ = uStack_c4;
          auVar104 = vfmadd231ps_avx512vl(auVar104,auVar110,auVar115);
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar110,local_460);
          auVar106 = vfmadd231ps_avx512vl(auVar50,auVar110,local_c0);
          auVar104 = vfmadd231ps_avx512vl(auVar104,auVar100,auVar119);
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar100,auVar117);
          auVar95 = vfmadd231ps_fma(auVar106,auVar100,local_a0);
          auVar106 = vfmadd231ps_avx512vl(auVar104,auVar99,auVar118);
          auVar107 = vfmadd231ps_avx512vl(auVar102,auVar99,local_340);
          auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar99,local_80);
          auVar108 = vmaxps_avx512vl(ZEXT1632(auVar96),ZEXT1632(auVar95));
          auVar104 = vsubps_avx(auVar106,auVar103);
          auVar102 = vsubps_avx(auVar107,auVar105);
          auVar109 = vmulps_avx512vl(auVar105,auVar104);
          auVar113 = vmulps_avx512vl(auVar103,auVar102);
          auVar109 = vsubps_avx512vl(auVar109,auVar113);
          auVar113 = vmulps_avx512vl(auVar102,auVar102);
          auVar113 = vfmadd231ps_avx512vl(auVar113,auVar104,auVar104);
          auVar108 = vmulps_avx512vl(auVar108,auVar108);
          auVar108 = vmulps_avx512vl(auVar108,auVar113);
          auVar109 = vmulps_avx512vl(auVar109,auVar109);
          uVar146 = vcmpps_avx512vl(auVar109,auVar108,2);
          local_230 = (byte)uVar24 & (byte)uVar146;
          if (local_230 == 0) {
            auVar220 = ZEXT3264(auVar117);
            auVar218 = ZEXT3264(auVar115);
          }
          else {
            auVar101 = vmulps_avx512vl(local_3c0,auVar101);
            auVar110 = vfmadd213ps_avx512vl(auVar110,local_140,auVar101);
            auVar100 = vfmadd213ps_avx512vl(auVar100,local_120,auVar110);
            auVar99 = vfmadd213ps_avx512vl(auVar99,local_100,auVar100);
            auVar111 = vmulps_avx512vl(local_3c0,auVar111);
            auVar112 = vfmadd213ps_avx512vl(auVar112,local_140,auVar111);
            auVar116 = vfmadd213ps_avx512vl(auVar116,local_120,auVar112);
            auVar100 = vfmadd213ps_avx512vl(auVar114,local_100,auVar116);
            auVar114 = *(undefined1 (*) [32])(lVar25 + 0x222cd38 + lVar82 * 4);
            auVar116 = *(undefined1 (*) [32])(lVar25 + 0x222d1bc + lVar82 * 4);
            auVar112 = *(undefined1 (*) [32])(lVar25 + 0x222d640 + lVar82 * 4);
            auVar111 = *(undefined1 (*) [32])(lVar25 + 0x222dac4 + lVar82 * 4);
            auVar110 = vmulps_avx512vl(local_480,auVar111);
            auVar101 = vmulps_avx512vl(local_4a0,auVar111);
            auVar111 = vmulps_avx512vl(local_3c0,auVar111);
            auVar110 = vfmadd231ps_avx512vl(auVar110,auVar112,auVar115);
            auVar101 = vfmadd231ps_avx512vl(auVar101,auVar112,local_460);
            auVar112 = vfmadd231ps_avx512vl(auVar111,local_140,auVar112);
            auVar111 = vfmadd231ps_avx512vl(auVar110,auVar116,auVar119);
            auVar110 = vfmadd231ps_avx512vl(auVar101,auVar116,auVar117);
            auVar116 = vfmadd231ps_avx512vl(auVar112,local_120,auVar116);
            auVar111 = vfmadd231ps_avx512vl(auVar111,auVar114,auVar118);
            auVar110 = vfmadd231ps_avx512vl(auVar110,auVar114,local_340);
            auVar101 = vfmadd231ps_avx512vl(auVar116,local_100,auVar114);
            auVar114 = *(undefined1 (*) [32])(lVar25 + 0x222f158 + lVar82 * 4);
            auVar116 = *(undefined1 (*) [32])(lVar25 + 0x222fa60 + lVar82 * 4);
            auVar112 = *(undefined1 (*) [32])(lVar25 + 0x222fee4 + lVar82 * 4);
            auVar108 = vmulps_avx512vl(local_480,auVar112);
            auVar109 = vmulps_avx512vl(local_4a0,auVar112);
            auVar112 = vmulps_avx512vl(local_3c0,auVar112);
            auVar108 = vfmadd231ps_avx512vl(auVar108,auVar116,auVar115);
            auVar109 = vfmadd231ps_avx512vl(auVar109,auVar116,local_460);
            auVar112 = vfmadd231ps_avx512vl(auVar112,local_140,auVar116);
            auVar116 = *(undefined1 (*) [32])(lVar25 + 0x222f5dc + lVar82 * 4);
            auVar108 = vfmadd231ps_avx512vl(auVar108,auVar116,auVar119);
            auVar109 = vfmadd231ps_avx512vl(auVar109,auVar116,auVar117);
            auVar116 = vfmadd231ps_avx512vl(auVar112,local_120,auVar116);
            auVar112 = vfmadd231ps_avx512vl(auVar108,auVar114,auVar118);
            auVar108 = vfmadd231ps_avx512vl(auVar109,auVar114,local_340);
            auVar116 = vfmadd231ps_avx512vl(auVar116,local_100,auVar114);
            auVar109 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar111,auVar109);
            vandps_avx512vl(auVar110,auVar109);
            auVar114 = vmaxps_avx(auVar109,auVar109);
            vandps_avx512vl(auVar101,auVar109);
            auVar114 = vmaxps_avx(auVar114,auVar109);
            auVar72._4_4_ = fStack_3dc;
            auVar72._0_4_ = local_3e0;
            auVar72._8_4_ = fStack_3d8;
            auVar72._12_4_ = fStack_3d4;
            auVar72._16_4_ = fStack_3d0;
            auVar72._20_4_ = fStack_3cc;
            auVar72._24_4_ = fStack_3c8;
            auVar72._28_4_ = fStack_3c4;
            uVar76 = vcmpps_avx512vl(auVar114,auVar72,1);
            bVar12 = (bool)((byte)uVar76 & 1);
            auVar126._0_4_ = (float)((uint)bVar12 * auVar104._0_4_ | (uint)!bVar12 * auVar111._0_4_)
            ;
            bVar12 = (bool)((byte)(uVar76 >> 1) & 1);
            auVar126._4_4_ = (float)((uint)bVar12 * auVar104._4_4_ | (uint)!bVar12 * auVar111._4_4_)
            ;
            bVar12 = (bool)((byte)(uVar76 >> 2) & 1);
            auVar126._8_4_ = (float)((uint)bVar12 * auVar104._8_4_ | (uint)!bVar12 * auVar111._8_4_)
            ;
            bVar12 = (bool)((byte)(uVar76 >> 3) & 1);
            auVar126._12_4_ =
                 (float)((uint)bVar12 * auVar104._12_4_ | (uint)!bVar12 * auVar111._12_4_);
            bVar12 = (bool)((byte)(uVar76 >> 4) & 1);
            auVar126._16_4_ =
                 (float)((uint)bVar12 * auVar104._16_4_ | (uint)!bVar12 * auVar111._16_4_);
            bVar12 = (bool)((byte)(uVar76 >> 5) & 1);
            auVar126._20_4_ =
                 (float)((uint)bVar12 * auVar104._20_4_ | (uint)!bVar12 * auVar111._20_4_);
            bVar12 = (bool)((byte)(uVar76 >> 6) & 1);
            auVar126._24_4_ =
                 (float)((uint)bVar12 * auVar104._24_4_ | (uint)!bVar12 * auVar111._24_4_);
            bVar12 = SUB81(uVar76 >> 7,0);
            auVar126._28_4_ = (uint)bVar12 * auVar104._28_4_ | (uint)!bVar12 * auVar111._28_4_;
            bVar12 = (bool)((byte)uVar76 & 1);
            auVar127._0_4_ = (float)((uint)bVar12 * auVar102._0_4_ | (uint)!bVar12 * auVar110._0_4_)
            ;
            bVar12 = (bool)((byte)(uVar76 >> 1) & 1);
            auVar127._4_4_ = (float)((uint)bVar12 * auVar102._4_4_ | (uint)!bVar12 * auVar110._4_4_)
            ;
            bVar12 = (bool)((byte)(uVar76 >> 2) & 1);
            auVar127._8_4_ = (float)((uint)bVar12 * auVar102._8_4_ | (uint)!bVar12 * auVar110._8_4_)
            ;
            bVar12 = (bool)((byte)(uVar76 >> 3) & 1);
            auVar127._12_4_ =
                 (float)((uint)bVar12 * auVar102._12_4_ | (uint)!bVar12 * auVar110._12_4_);
            bVar12 = (bool)((byte)(uVar76 >> 4) & 1);
            auVar127._16_4_ =
                 (float)((uint)bVar12 * auVar102._16_4_ | (uint)!bVar12 * auVar110._16_4_);
            bVar12 = (bool)((byte)(uVar76 >> 5) & 1);
            auVar127._20_4_ =
                 (float)((uint)bVar12 * auVar102._20_4_ | (uint)!bVar12 * auVar110._20_4_);
            bVar12 = (bool)((byte)(uVar76 >> 6) & 1);
            auVar127._24_4_ =
                 (float)((uint)bVar12 * auVar102._24_4_ | (uint)!bVar12 * auVar110._24_4_);
            bVar12 = SUB81(uVar76 >> 7,0);
            auVar127._28_4_ = (uint)bVar12 * auVar102._28_4_ | (uint)!bVar12 * auVar110._28_4_;
            vandps_avx512vl(auVar112,auVar109);
            vandps_avx512vl(auVar108,auVar109);
            auVar114 = vmaxps_avx(auVar127,auVar127);
            vandps_avx512vl(auVar116,auVar109);
            auVar114 = vmaxps_avx(auVar114,auVar127);
            uVar76 = vcmpps_avx512vl(auVar114,auVar72,1);
            bVar12 = (bool)((byte)uVar76 & 1);
            auVar128._0_4_ = (uint)bVar12 * auVar104._0_4_ | (uint)!bVar12 * auVar112._0_4_;
            bVar12 = (bool)((byte)(uVar76 >> 1) & 1);
            auVar128._4_4_ = (uint)bVar12 * auVar104._4_4_ | (uint)!bVar12 * auVar112._4_4_;
            bVar12 = (bool)((byte)(uVar76 >> 2) & 1);
            auVar128._8_4_ = (uint)bVar12 * auVar104._8_4_ | (uint)!bVar12 * auVar112._8_4_;
            bVar12 = (bool)((byte)(uVar76 >> 3) & 1);
            auVar128._12_4_ = (uint)bVar12 * auVar104._12_4_ | (uint)!bVar12 * auVar112._12_4_;
            bVar12 = (bool)((byte)(uVar76 >> 4) & 1);
            auVar128._16_4_ = (uint)bVar12 * auVar104._16_4_ | (uint)!bVar12 * auVar112._16_4_;
            bVar12 = (bool)((byte)(uVar76 >> 5) & 1);
            auVar128._20_4_ = (uint)bVar12 * auVar104._20_4_ | (uint)!bVar12 * auVar112._20_4_;
            bVar12 = (bool)((byte)(uVar76 >> 6) & 1);
            auVar128._24_4_ = (uint)bVar12 * auVar104._24_4_ | (uint)!bVar12 * auVar112._24_4_;
            bVar12 = SUB81(uVar76 >> 7,0);
            auVar128._28_4_ = (uint)bVar12 * auVar104._28_4_ | (uint)!bVar12 * auVar112._28_4_;
            bVar12 = (bool)((byte)uVar76 & 1);
            auVar129._0_4_ = (float)((uint)bVar12 * auVar102._0_4_ | (uint)!bVar12 * auVar108._0_4_)
            ;
            bVar12 = (bool)((byte)(uVar76 >> 1) & 1);
            auVar129._4_4_ = (float)((uint)bVar12 * auVar102._4_4_ | (uint)!bVar12 * auVar108._4_4_)
            ;
            bVar12 = (bool)((byte)(uVar76 >> 2) & 1);
            auVar129._8_4_ = (float)((uint)bVar12 * auVar102._8_4_ | (uint)!bVar12 * auVar108._8_4_)
            ;
            bVar12 = (bool)((byte)(uVar76 >> 3) & 1);
            auVar129._12_4_ =
                 (float)((uint)bVar12 * auVar102._12_4_ | (uint)!bVar12 * auVar108._12_4_);
            bVar12 = (bool)((byte)(uVar76 >> 4) & 1);
            auVar129._16_4_ =
                 (float)((uint)bVar12 * auVar102._16_4_ | (uint)!bVar12 * auVar108._16_4_);
            bVar12 = (bool)((byte)(uVar76 >> 5) & 1);
            auVar129._20_4_ =
                 (float)((uint)bVar12 * auVar102._20_4_ | (uint)!bVar12 * auVar108._20_4_);
            bVar12 = (bool)((byte)(uVar76 >> 6) & 1);
            auVar129._24_4_ =
                 (float)((uint)bVar12 * auVar102._24_4_ | (uint)!bVar12 * auVar108._24_4_);
            bVar12 = SUB81(uVar76 >> 7,0);
            auVar129._28_4_ = (uint)bVar12 * auVar102._28_4_ | (uint)!bVar12 * auVar108._28_4_;
            auVar208._8_4_ = 0x80000000;
            auVar208._0_8_ = 0x8000000080000000;
            auVar208._12_4_ = 0x80000000;
            auVar208._16_4_ = 0x80000000;
            auVar208._20_4_ = 0x80000000;
            auVar208._24_4_ = 0x80000000;
            auVar208._28_4_ = 0x80000000;
            auVar114 = vxorps_avx512vl(auVar128,auVar208);
            auVar108 = auVar225._0_32_;
            auVar116 = vfmadd213ps_avx512vl(auVar126,auVar126,auVar108);
            auVar89 = vfmadd231ps_fma(auVar116,auVar127,auVar127);
            auVar116 = vrsqrt14ps_avx512vl(ZEXT1632(auVar89));
            auVar217._8_4_ = 0xbf000000;
            auVar217._0_8_ = 0xbf000000bf000000;
            auVar217._12_4_ = 0xbf000000;
            auVar217._16_4_ = 0xbf000000;
            auVar217._20_4_ = 0xbf000000;
            auVar217._24_4_ = 0xbf000000;
            auVar217._28_4_ = 0xbf000000;
            fVar174 = auVar116._0_4_;
            fVar178 = auVar116._4_4_;
            fVar173 = auVar116._8_4_;
            fVar177 = auVar116._12_4_;
            fVar193 = auVar116._16_4_;
            fVar194 = auVar116._20_4_;
            fVar195 = auVar116._24_4_;
            auVar51._4_4_ = fVar178 * fVar178 * fVar178 * auVar89._4_4_ * -0.5;
            auVar51._0_4_ = fVar174 * fVar174 * fVar174 * auVar89._0_4_ * -0.5;
            auVar51._8_4_ = fVar173 * fVar173 * fVar173 * auVar89._8_4_ * -0.5;
            auVar51._12_4_ = fVar177 * fVar177 * fVar177 * auVar89._12_4_ * -0.5;
            auVar51._16_4_ = fVar193 * fVar193 * fVar193 * -0.0;
            auVar51._20_4_ = fVar194 * fVar194 * fVar194 * -0.0;
            auVar51._24_4_ = fVar195 * fVar195 * fVar195 * -0.0;
            auVar51._28_4_ = auVar127._28_4_;
            auVar112 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar116 = vfmadd231ps_avx512vl(auVar51,auVar112,auVar116);
            auVar52._4_4_ = auVar127._4_4_ * auVar116._4_4_;
            auVar52._0_4_ = auVar127._0_4_ * auVar116._0_4_;
            auVar52._8_4_ = auVar127._8_4_ * auVar116._8_4_;
            auVar52._12_4_ = auVar127._12_4_ * auVar116._12_4_;
            auVar52._16_4_ = auVar127._16_4_ * auVar116._16_4_;
            auVar52._20_4_ = auVar127._20_4_ * auVar116._20_4_;
            auVar52._24_4_ = auVar127._24_4_ * auVar116._24_4_;
            auVar52._28_4_ = 0;
            auVar53._4_4_ = auVar116._4_4_ * -auVar126._4_4_;
            auVar53._0_4_ = auVar116._0_4_ * -auVar126._0_4_;
            auVar53._8_4_ = auVar116._8_4_ * -auVar126._8_4_;
            auVar53._12_4_ = auVar116._12_4_ * -auVar126._12_4_;
            auVar53._16_4_ = auVar116._16_4_ * -auVar126._16_4_;
            auVar53._20_4_ = auVar116._20_4_ * -auVar126._20_4_;
            auVar53._24_4_ = auVar116._24_4_ * -auVar126._24_4_;
            auVar53._28_4_ = auVar127._28_4_;
            auVar111 = vmulps_avx512vl(auVar116,auVar108);
            auVar116 = vfmadd213ps_avx512vl(auVar128,auVar128,auVar108);
            auVar116 = vfmadd231ps_avx512vl(auVar116,auVar129,auVar129);
            auVar110 = vrsqrt14ps_avx512vl(auVar116);
            auVar116 = vmulps_avx512vl(auVar116,auVar217);
            fVar174 = auVar110._0_4_;
            fVar178 = auVar110._4_4_;
            fVar173 = auVar110._8_4_;
            fVar177 = auVar110._12_4_;
            fVar193 = auVar110._16_4_;
            fVar194 = auVar110._20_4_;
            fVar195 = auVar110._24_4_;
            auVar54._4_4_ = fVar178 * fVar178 * fVar178 * auVar116._4_4_;
            auVar54._0_4_ = fVar174 * fVar174 * fVar174 * auVar116._0_4_;
            auVar54._8_4_ = fVar173 * fVar173 * fVar173 * auVar116._8_4_;
            auVar54._12_4_ = fVar177 * fVar177 * fVar177 * auVar116._12_4_;
            auVar54._16_4_ = fVar193 * fVar193 * fVar193 * auVar116._16_4_;
            auVar54._20_4_ = fVar194 * fVar194 * fVar194 * auVar116._20_4_;
            auVar54._24_4_ = fVar195 * fVar195 * fVar195 * auVar116._24_4_;
            auVar54._28_4_ = auVar116._28_4_;
            auVar116 = vfmadd231ps_avx512vl(auVar54,auVar112,auVar110);
            auVar55._4_4_ = auVar129._4_4_ * auVar116._4_4_;
            auVar55._0_4_ = auVar129._0_4_ * auVar116._0_4_;
            auVar55._8_4_ = auVar129._8_4_ * auVar116._8_4_;
            auVar55._12_4_ = auVar129._12_4_ * auVar116._12_4_;
            auVar55._16_4_ = auVar129._16_4_ * auVar116._16_4_;
            auVar55._20_4_ = auVar129._20_4_ * auVar116._20_4_;
            auVar55._24_4_ = auVar129._24_4_ * auVar116._24_4_;
            auVar55._28_4_ = auVar110._28_4_;
            auVar56._4_4_ = auVar116._4_4_ * auVar114._4_4_;
            auVar56._0_4_ = auVar116._0_4_ * auVar114._0_4_;
            auVar56._8_4_ = auVar116._8_4_ * auVar114._8_4_;
            auVar56._12_4_ = auVar116._12_4_ * auVar114._12_4_;
            auVar56._16_4_ = auVar116._16_4_ * auVar114._16_4_;
            auVar56._20_4_ = auVar116._20_4_ * auVar114._20_4_;
            auVar56._24_4_ = auVar116._24_4_ * auVar114._24_4_;
            auVar56._28_4_ = auVar114._28_4_;
            auVar114 = vmulps_avx512vl(auVar116,auVar108);
            auVar89 = vfmadd213ps_fma(auVar52,ZEXT1632(auVar96),auVar103);
            auVar116 = ZEXT1632(auVar96);
            auVar224 = vfmadd213ps_fma(auVar53,auVar116,auVar105);
            auVar112 = vfmadd213ps_avx512vl(auVar111,auVar116,auVar100);
            auVar110 = vfmadd213ps_avx512vl(auVar55,ZEXT1632(auVar95),auVar106);
            auVar91 = vfnmadd213ps_fma(auVar52,auVar116,auVar103);
            auVar101 = ZEXT1632(auVar95);
            auVar19 = vfmadd213ps_fma(auVar56,auVar101,auVar107);
            auVar22 = vfnmadd213ps_fma(auVar53,auVar116,auVar105);
            auVar90 = vfmadd213ps_fma(auVar114,auVar101,auVar99);
            auVar105 = ZEXT1632(auVar96);
            auVar27 = vfnmadd231ps_fma(auVar100,auVar105,auVar111);
            auVar23 = vfnmadd213ps_fma(auVar55,auVar101,auVar106);
            auVar26 = vfnmadd213ps_fma(auVar56,auVar101,auVar107);
            auVar88 = vfnmadd231ps_fma(auVar99,ZEXT1632(auVar95),auVar114);
            auVar99 = vsubps_avx512vl(auVar110,ZEXT1632(auVar91));
            auVar114 = vsubps_avx(ZEXT1632(auVar19),ZEXT1632(auVar22));
            auVar116 = vsubps_avx(ZEXT1632(auVar90),ZEXT1632(auVar27));
            auVar57._4_4_ = auVar114._4_4_ * auVar27._4_4_;
            auVar57._0_4_ = auVar114._0_4_ * auVar27._0_4_;
            auVar57._8_4_ = auVar114._8_4_ * auVar27._8_4_;
            auVar57._12_4_ = auVar114._12_4_ * auVar27._12_4_;
            auVar57._16_4_ = auVar114._16_4_ * 0.0;
            auVar57._20_4_ = auVar114._20_4_ * 0.0;
            auVar57._24_4_ = auVar114._24_4_ * 0.0;
            auVar57._28_4_ = auVar111._28_4_;
            auVar96 = vfmsub231ps_fma(auVar57,ZEXT1632(auVar22),auVar116);
            auVar58._4_4_ = auVar116._4_4_ * auVar91._4_4_;
            auVar58._0_4_ = auVar116._0_4_ * auVar91._0_4_;
            auVar58._8_4_ = auVar116._8_4_ * auVar91._8_4_;
            auVar58._12_4_ = auVar116._12_4_ * auVar91._12_4_;
            auVar58._16_4_ = auVar116._16_4_ * 0.0;
            auVar58._20_4_ = auVar116._20_4_ * 0.0;
            auVar58._24_4_ = auVar116._24_4_ * 0.0;
            auVar58._28_4_ = auVar116._28_4_;
            auVar20 = vfmsub231ps_fma(auVar58,ZEXT1632(auVar27),auVar99);
            auVar59._4_4_ = auVar22._4_4_ * auVar99._4_4_;
            auVar59._0_4_ = auVar22._0_4_ * auVar99._0_4_;
            auVar59._8_4_ = auVar22._8_4_ * auVar99._8_4_;
            auVar59._12_4_ = auVar22._12_4_ * auVar99._12_4_;
            auVar59._16_4_ = auVar99._16_4_ * 0.0;
            auVar59._20_4_ = auVar99._20_4_ * 0.0;
            auVar59._24_4_ = auVar99._24_4_ * 0.0;
            auVar59._28_4_ = auVar99._28_4_;
            auVar21 = vfmsub231ps_fma(auVar59,ZEXT1632(auVar91),auVar114);
            auVar114 = vfmadd231ps_avx512vl(ZEXT1632(auVar21),auVar108,ZEXT1632(auVar20));
            auVar114 = vfmadd231ps_avx512vl(auVar114,auVar108,ZEXT1632(auVar96));
            uVar76 = vcmpps_avx512vl(auVar114,auVar108,2);
            bVar85 = (byte)uVar76;
            fVar87 = (float)((uint)(bVar85 & 1) * auVar89._0_4_ |
                            (uint)!(bool)(bVar85 & 1) * auVar23._0_4_);
            bVar12 = (bool)((byte)(uVar76 >> 1) & 1);
            fVar139 = (float)((uint)bVar12 * auVar89._4_4_ | (uint)!bVar12 * auVar23._4_4_);
            bVar12 = (bool)((byte)(uVar76 >> 2) & 1);
            fVar141 = (float)((uint)bVar12 * auVar89._8_4_ | (uint)!bVar12 * auVar23._8_4_);
            bVar12 = (bool)((byte)(uVar76 >> 3) & 1);
            fVar143 = (float)((uint)bVar12 * auVar89._12_4_ | (uint)!bVar12 * auVar23._12_4_);
            auVar101 = ZEXT1632(CONCAT412(fVar143,CONCAT48(fVar141,CONCAT44(fVar139,fVar87))));
            fVar138 = (float)((uint)(bVar85 & 1) * auVar224._0_4_ |
                             (uint)!(bool)(bVar85 & 1) * auVar26._0_4_);
            bVar12 = (bool)((byte)(uVar76 >> 1) & 1);
            fVar140 = (float)((uint)bVar12 * auVar224._4_4_ | (uint)!bVar12 * auVar26._4_4_);
            bVar12 = (bool)((byte)(uVar76 >> 2) & 1);
            fVar142 = (float)((uint)bVar12 * auVar224._8_4_ | (uint)!bVar12 * auVar26._8_4_);
            bVar12 = (bool)((byte)(uVar76 >> 3) & 1);
            fVar144 = (float)((uint)bVar12 * auVar224._12_4_ | (uint)!bVar12 * auVar26._12_4_);
            auVar104 = ZEXT1632(CONCAT412(fVar144,CONCAT48(fVar142,CONCAT44(fVar140,fVar138))));
            auVar130._0_4_ =
                 (float)((uint)(bVar85 & 1) * auVar112._0_4_ |
                        (uint)!(bool)(bVar85 & 1) * auVar88._0_4_);
            bVar12 = (bool)((byte)(uVar76 >> 1) & 1);
            auVar130._4_4_ = (float)((uint)bVar12 * auVar112._4_4_ | (uint)!bVar12 * auVar88._4_4_);
            bVar12 = (bool)((byte)(uVar76 >> 2) & 1);
            auVar130._8_4_ = (float)((uint)bVar12 * auVar112._8_4_ | (uint)!bVar12 * auVar88._8_4_);
            bVar12 = (bool)((byte)(uVar76 >> 3) & 1);
            auVar130._12_4_ =
                 (float)((uint)bVar12 * auVar112._12_4_ | (uint)!bVar12 * auVar88._12_4_);
            fVar173 = (float)((uint)((byte)(uVar76 >> 4) & 1) * auVar112._16_4_);
            auVar130._16_4_ = fVar173;
            fVar178 = (float)((uint)((byte)(uVar76 >> 5) & 1) * auVar112._20_4_);
            auVar130._20_4_ = fVar178;
            fVar174 = (float)((uint)((byte)(uVar76 >> 6) & 1) * auVar112._24_4_);
            auVar130._24_4_ = fVar174;
            iVar1 = (uint)(byte)(uVar76 >> 7) * auVar112._28_4_;
            auVar130._28_4_ = iVar1;
            auVar114 = vblendmps_avx512vl(ZEXT1632(auVar91),auVar110);
            auVar131._0_4_ =
                 (uint)(bVar85 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar85 & 1) * auVar96._0_4_;
            bVar12 = (bool)((byte)(uVar76 >> 1) & 1);
            auVar131._4_4_ = (uint)bVar12 * auVar114._4_4_ | (uint)!bVar12 * auVar96._4_4_;
            bVar12 = (bool)((byte)(uVar76 >> 2) & 1);
            auVar131._8_4_ = (uint)bVar12 * auVar114._8_4_ | (uint)!bVar12 * auVar96._8_4_;
            bVar12 = (bool)((byte)(uVar76 >> 3) & 1);
            auVar131._12_4_ = (uint)bVar12 * auVar114._12_4_ | (uint)!bVar12 * auVar96._12_4_;
            auVar131._16_4_ = (uint)((byte)(uVar76 >> 4) & 1) * auVar114._16_4_;
            auVar131._20_4_ = (uint)((byte)(uVar76 >> 5) & 1) * auVar114._20_4_;
            auVar131._24_4_ = (uint)((byte)(uVar76 >> 6) & 1) * auVar114._24_4_;
            auVar131._28_4_ = (uint)(byte)(uVar76 >> 7) * auVar114._28_4_;
            auVar114 = vblendmps_avx512vl(ZEXT1632(auVar22),ZEXT1632(auVar19));
            auVar132._0_4_ =
                 (float)((uint)(bVar85 & 1) * auVar114._0_4_ |
                        (uint)!(bool)(bVar85 & 1) * auVar89._0_4_);
            bVar12 = (bool)((byte)(uVar76 >> 1) & 1);
            auVar132._4_4_ = (float)((uint)bVar12 * auVar114._4_4_ | (uint)!bVar12 * auVar89._4_4_);
            bVar12 = (bool)((byte)(uVar76 >> 2) & 1);
            auVar132._8_4_ = (float)((uint)bVar12 * auVar114._8_4_ | (uint)!bVar12 * auVar89._8_4_);
            bVar12 = (bool)((byte)(uVar76 >> 3) & 1);
            auVar132._12_4_ =
                 (float)((uint)bVar12 * auVar114._12_4_ | (uint)!bVar12 * auVar89._12_4_);
            fVar177 = (float)((uint)((byte)(uVar76 >> 4) & 1) * auVar114._16_4_);
            auVar132._16_4_ = fVar177;
            fVar193 = (float)((uint)((byte)(uVar76 >> 5) & 1) * auVar114._20_4_);
            auVar132._20_4_ = fVar193;
            fVar194 = (float)((uint)((byte)(uVar76 >> 6) & 1) * auVar114._24_4_);
            auVar132._24_4_ = fVar194;
            auVar132._28_4_ = (uint)(byte)(uVar76 >> 7) * auVar114._28_4_;
            auVar114 = vblendmps_avx512vl(ZEXT1632(auVar27),ZEXT1632(auVar90));
            auVar133._0_4_ =
                 (float)((uint)(bVar85 & 1) * auVar114._0_4_ |
                        (uint)!(bool)(bVar85 & 1) * auVar224._0_4_);
            bVar12 = (bool)((byte)(uVar76 >> 1) & 1);
            auVar133._4_4_ = (float)((uint)bVar12 * auVar114._4_4_ | (uint)!bVar12 * auVar224._4_4_)
            ;
            bVar12 = (bool)((byte)(uVar76 >> 2) & 1);
            auVar133._8_4_ = (float)((uint)bVar12 * auVar114._8_4_ | (uint)!bVar12 * auVar224._8_4_)
            ;
            bVar12 = (bool)((byte)(uVar76 >> 3) & 1);
            auVar133._12_4_ =
                 (float)((uint)bVar12 * auVar114._12_4_ | (uint)!bVar12 * auVar224._12_4_);
            fVar176 = (float)((uint)((byte)(uVar76 >> 4) & 1) * auVar114._16_4_);
            auVar133._16_4_ = fVar176;
            fVar86 = (float)((uint)((byte)(uVar76 >> 5) & 1) * auVar114._20_4_);
            auVar133._20_4_ = fVar86;
            fVar195 = (float)((uint)((byte)(uVar76 >> 6) & 1) * auVar114._24_4_);
            auVar133._24_4_ = fVar195;
            iVar2 = (uint)(byte)(uVar76 >> 7) * auVar114._28_4_;
            auVar133._28_4_ = iVar2;
            auVar134._0_4_ =
                 (uint)(bVar85 & 1) * (int)auVar91._0_4_ |
                 (uint)!(bool)(bVar85 & 1) * auVar110._0_4_;
            bVar12 = (bool)((byte)(uVar76 >> 1) & 1);
            auVar134._4_4_ = (uint)bVar12 * (int)auVar91._4_4_ | (uint)!bVar12 * auVar110._4_4_;
            bVar12 = (bool)((byte)(uVar76 >> 2) & 1);
            auVar134._8_4_ = (uint)bVar12 * (int)auVar91._8_4_ | (uint)!bVar12 * auVar110._8_4_;
            bVar12 = (bool)((byte)(uVar76 >> 3) & 1);
            auVar134._12_4_ = (uint)bVar12 * (int)auVar91._12_4_ | (uint)!bVar12 * auVar110._12_4_;
            auVar134._16_4_ = (uint)!(bool)((byte)(uVar76 >> 4) & 1) * auVar110._16_4_;
            auVar134._20_4_ = (uint)!(bool)((byte)(uVar76 >> 5) & 1) * auVar110._20_4_;
            auVar134._24_4_ = (uint)!(bool)((byte)(uVar76 >> 6) & 1) * auVar110._24_4_;
            auVar134._28_4_ = (uint)!SUB81(uVar76 >> 7,0) * auVar110._28_4_;
            bVar12 = (bool)((byte)(uVar76 >> 1) & 1);
            bVar14 = (bool)((byte)(uVar76 >> 2) & 1);
            bVar16 = (bool)((byte)(uVar76 >> 3) & 1);
            bVar13 = (bool)((byte)(uVar76 >> 1) & 1);
            bVar15 = (bool)((byte)(uVar76 >> 2) & 1);
            bVar17 = (bool)((byte)(uVar76 >> 3) & 1);
            auVar110 = vsubps_avx512vl(auVar134,auVar101);
            auVar116 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar22._12_4_ |
                                                     (uint)!bVar16 * auVar19._12_4_,
                                                     CONCAT48((uint)bVar14 * (int)auVar22._8_4_ |
                                                              (uint)!bVar14 * auVar19._8_4_,
                                                              CONCAT44((uint)bVar12 *
                                                                       (int)auVar22._4_4_ |
                                                                       (uint)!bVar12 * auVar19._4_4_
                                                                       ,(uint)(bVar85 & 1) *
                                                                        (int)auVar22._0_4_ |
                                                                        (uint)!(bool)(bVar85 & 1) *
                                                                        auVar19._0_4_)))),auVar104);
            auVar112 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar27._12_4_ |
                                                     (uint)!bVar17 * auVar90._12_4_,
                                                     CONCAT48((uint)bVar15 * (int)auVar27._8_4_ |
                                                              (uint)!bVar15 * auVar90._8_4_,
                                                              CONCAT44((uint)bVar13 *
                                                                       (int)auVar27._4_4_ |
                                                                       (uint)!bVar13 * auVar90._4_4_
                                                                       ,(uint)(bVar85 & 1) *
                                                                        (int)auVar27._0_4_ |
                                                                        (uint)!(bool)(bVar85 & 1) *
                                                                        auVar90._0_4_)))),auVar130);
            auVar111 = vsubps_avx(auVar101,auVar131);
            auVar99 = vsubps_avx(auVar104,auVar132);
            auVar100 = vsubps_avx(auVar130,auVar133);
            auVar60._4_4_ = auVar112._4_4_ * fVar139;
            auVar60._0_4_ = auVar112._0_4_ * fVar87;
            auVar60._8_4_ = auVar112._8_4_ * fVar141;
            auVar60._12_4_ = auVar112._12_4_ * fVar143;
            auVar60._16_4_ = auVar112._16_4_ * 0.0;
            auVar60._20_4_ = auVar112._20_4_ * 0.0;
            auVar60._24_4_ = auVar112._24_4_ * 0.0;
            auVar60._28_4_ = 0;
            auVar96 = vfmsub231ps_fma(auVar60,auVar130,auVar110);
            auVar175._0_4_ = fVar138 * auVar110._0_4_;
            auVar175._4_4_ = fVar140 * auVar110._4_4_;
            auVar175._8_4_ = fVar142 * auVar110._8_4_;
            auVar175._12_4_ = fVar144 * auVar110._12_4_;
            auVar175._16_4_ = auVar110._16_4_ * 0.0;
            auVar175._20_4_ = auVar110._20_4_ * 0.0;
            auVar175._24_4_ = auVar110._24_4_ * 0.0;
            auVar175._28_4_ = 0;
            auVar89 = vfmsub231ps_fma(auVar175,auVar101,auVar116);
            auVar114 = vfmadd231ps_avx512vl(ZEXT1632(auVar89),auVar108,ZEXT1632(auVar96));
            auVar191._0_4_ = auVar116._0_4_ * auVar130._0_4_;
            auVar191._4_4_ = auVar116._4_4_ * auVar130._4_4_;
            auVar191._8_4_ = auVar116._8_4_ * auVar130._8_4_;
            auVar191._12_4_ = auVar116._12_4_ * auVar130._12_4_;
            auVar191._16_4_ = auVar116._16_4_ * fVar173;
            auVar191._20_4_ = auVar116._20_4_ * fVar178;
            auVar191._24_4_ = auVar116._24_4_ * fVar174;
            auVar191._28_4_ = 0;
            auVar96 = vfmsub231ps_fma(auVar191,auVar104,auVar112);
            auVar102 = vfmadd231ps_avx512vl(auVar114,auVar108,ZEXT1632(auVar96));
            auVar114 = vmulps_avx512vl(auVar100,auVar131);
            auVar114 = vfmsub231ps_avx512vl(auVar114,auVar111,auVar133);
            auVar61._4_4_ = auVar99._4_4_ * auVar133._4_4_;
            auVar61._0_4_ = auVar99._0_4_ * auVar133._0_4_;
            auVar61._8_4_ = auVar99._8_4_ * auVar133._8_4_;
            auVar61._12_4_ = auVar99._12_4_ * auVar133._12_4_;
            auVar61._16_4_ = auVar99._16_4_ * fVar176;
            auVar61._20_4_ = auVar99._20_4_ * fVar86;
            auVar61._24_4_ = auVar99._24_4_ * fVar195;
            auVar61._28_4_ = iVar2;
            auVar96 = vfmsub231ps_fma(auVar61,auVar132,auVar100);
            auVar192._0_4_ = auVar132._0_4_ * auVar111._0_4_;
            auVar192._4_4_ = auVar132._4_4_ * auVar111._4_4_;
            auVar192._8_4_ = auVar132._8_4_ * auVar111._8_4_;
            auVar192._12_4_ = auVar132._12_4_ * auVar111._12_4_;
            auVar192._16_4_ = fVar177 * auVar111._16_4_;
            auVar192._20_4_ = fVar193 * auVar111._20_4_;
            auVar192._24_4_ = fVar194 * auVar111._24_4_;
            auVar192._28_4_ = 0;
            auVar89 = vfmsub231ps_fma(auVar192,auVar99,auVar131);
            auVar114 = vfmadd231ps_avx512vl(ZEXT1632(auVar89),auVar108,auVar114);
            auVar103 = vfmadd231ps_avx512vl(auVar114,auVar108,ZEXT1632(auVar96));
            auVar114 = vmaxps_avx(auVar102,auVar103);
            uVar146 = vcmpps_avx512vl(auVar114,auVar108,2);
            local_230 = local_230 & (byte)uVar146;
            if (local_230 == 0) {
LAB_01c45724:
              local_230 = 0;
            }
            else {
              auVar62._4_4_ = auVar100._4_4_ * auVar116._4_4_;
              auVar62._0_4_ = auVar100._0_4_ * auVar116._0_4_;
              auVar62._8_4_ = auVar100._8_4_ * auVar116._8_4_;
              auVar62._12_4_ = auVar100._12_4_ * auVar116._12_4_;
              auVar62._16_4_ = auVar100._16_4_ * auVar116._16_4_;
              auVar62._20_4_ = auVar100._20_4_ * auVar116._20_4_;
              auVar62._24_4_ = auVar100._24_4_ * auVar116._24_4_;
              auVar62._28_4_ = auVar114._28_4_;
              auVar224 = vfmsub231ps_fma(auVar62,auVar99,auVar112);
              auVar63._4_4_ = auVar112._4_4_ * auVar111._4_4_;
              auVar63._0_4_ = auVar112._0_4_ * auVar111._0_4_;
              auVar63._8_4_ = auVar112._8_4_ * auVar111._8_4_;
              auVar63._12_4_ = auVar112._12_4_ * auVar111._12_4_;
              auVar63._16_4_ = auVar112._16_4_ * auVar111._16_4_;
              auVar63._20_4_ = auVar112._20_4_ * auVar111._20_4_;
              auVar63._24_4_ = auVar112._24_4_ * auVar111._24_4_;
              auVar63._28_4_ = auVar112._28_4_;
              auVar89 = vfmsub231ps_fma(auVar63,auVar110,auVar100);
              auVar64._4_4_ = auVar99._4_4_ * auVar110._4_4_;
              auVar64._0_4_ = auVar99._0_4_ * auVar110._0_4_;
              auVar64._8_4_ = auVar99._8_4_ * auVar110._8_4_;
              auVar64._12_4_ = auVar99._12_4_ * auVar110._12_4_;
              auVar64._16_4_ = auVar99._16_4_ * auVar110._16_4_;
              auVar64._20_4_ = auVar99._20_4_ * auVar110._20_4_;
              auVar64._24_4_ = auVar99._24_4_ * auVar110._24_4_;
              auVar64._28_4_ = auVar99._28_4_;
              auVar19 = vfmsub231ps_fma(auVar64,auVar111,auVar116);
              auVar96 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar89),ZEXT1632(auVar19));
              auVar114 = vfmadd231ps_avx512vl(ZEXT1632(auVar96),ZEXT1632(auVar224),auVar108);
              auVar116 = vrcp14ps_avx512vl(auVar114);
              auVar37._8_4_ = 0x3f800000;
              auVar37._0_8_ = &DAT_3f8000003f800000;
              auVar37._12_4_ = 0x3f800000;
              auVar37._16_4_ = 0x3f800000;
              auVar37._20_4_ = 0x3f800000;
              auVar37._24_4_ = 0x3f800000;
              auVar37._28_4_ = 0x3f800000;
              auVar112 = vfnmadd213ps_avx512vl(auVar116,auVar114,auVar37);
              auVar96 = vfmadd132ps_fma(auVar112,auVar116,auVar116);
              auVar65._4_4_ = auVar19._4_4_ * auVar130._4_4_;
              auVar65._0_4_ = auVar19._0_4_ * auVar130._0_4_;
              auVar65._8_4_ = auVar19._8_4_ * auVar130._8_4_;
              auVar65._12_4_ = auVar19._12_4_ * auVar130._12_4_;
              auVar65._16_4_ = fVar173 * 0.0;
              auVar65._20_4_ = fVar178 * 0.0;
              auVar65._24_4_ = fVar174 * 0.0;
              auVar65._28_4_ = iVar1;
              auVar89 = vfmadd231ps_fma(auVar65,auVar104,ZEXT1632(auVar89));
              auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar101,ZEXT1632(auVar224));
              fVar178 = auVar96._0_4_;
              fVar173 = auVar96._4_4_;
              fVar177 = auVar96._8_4_;
              fVar193 = auVar96._12_4_;
              auVar116 = ZEXT1632(CONCAT412(auVar89._12_4_ * fVar193,
                                            CONCAT48(auVar89._8_4_ * fVar177,
                                                     CONCAT44(auVar89._4_4_ * fVar173,
                                                              auVar89._0_4_ * fVar178))));
              auVar73._4_4_ = uStack_31c;
              auVar73._0_4_ = local_320;
              auVar73._8_4_ = uStack_318;
              auVar73._12_4_ = uStack_314;
              auVar73._16_4_ = uStack_310;
              auVar73._20_4_ = uStack_30c;
              auVar73._24_4_ = uStack_308;
              auVar73._28_4_ = uStack_304;
              uVar146 = vcmpps_avx512vl(auVar116,auVar73,0xd);
              fVar174 = (ray->super_RayK<1>).tfar;
              auVar38._4_4_ = fVar174;
              auVar38._0_4_ = fVar174;
              auVar38._8_4_ = fVar174;
              auVar38._12_4_ = fVar174;
              auVar38._16_4_ = fVar174;
              auVar38._20_4_ = fVar174;
              auVar38._24_4_ = fVar174;
              auVar38._28_4_ = fVar174;
              uVar24 = vcmpps_avx512vl(auVar116,auVar38,2);
              local_230 = (byte)uVar146 & (byte)uVar24 & local_230;
              if (local_230 == 0) goto LAB_01c45724;
              uVar146 = vcmpps_avx512vl(auVar114,auVar108,4);
              if ((local_230 & (byte)uVar146) == 0) {
                local_230 = 0;
              }
              else {
                local_230 = local_230 & (byte)uVar146;
                fVar174 = auVar102._0_4_ * fVar178;
                fVar194 = auVar102._4_4_ * fVar173;
                auVar66._4_4_ = fVar194;
                auVar66._0_4_ = fVar174;
                fVar195 = auVar102._8_4_ * fVar177;
                auVar66._8_4_ = fVar195;
                fVar176 = auVar102._12_4_ * fVar193;
                auVar66._12_4_ = fVar176;
                fVar86 = auVar102._16_4_ * 0.0;
                auVar66._16_4_ = fVar86;
                fVar87 = auVar102._20_4_ * 0.0;
                auVar66._20_4_ = fVar87;
                fVar138 = auVar102._24_4_ * 0.0;
                auVar66._24_4_ = fVar138;
                auVar66._28_4_ = auVar102._28_4_;
                fVar178 = auVar103._0_4_ * fVar178;
                fVar173 = auVar103._4_4_ * fVar173;
                auVar67._4_4_ = fVar173;
                auVar67._0_4_ = fVar178;
                fVar177 = auVar103._8_4_ * fVar177;
                auVar67._8_4_ = fVar177;
                fVar193 = auVar103._12_4_ * fVar193;
                auVar67._12_4_ = fVar193;
                fVar139 = auVar103._16_4_ * 0.0;
                auVar67._16_4_ = fVar139;
                fVar140 = auVar103._20_4_ * 0.0;
                auVar67._20_4_ = fVar140;
                fVar141 = auVar103._24_4_ * 0.0;
                auVar67._24_4_ = fVar141;
                auVar67._28_4_ = auVar103._28_4_;
                auVar199._8_4_ = 0x3f800000;
                auVar199._0_8_ = &DAT_3f8000003f800000;
                auVar199._12_4_ = 0x3f800000;
                auVar199._16_4_ = 0x3f800000;
                auVar199._20_4_ = 0x3f800000;
                auVar199._24_4_ = 0x3f800000;
                auVar199._28_4_ = 0x3f800000;
                auVar114 = vsubps_avx(auVar199,auVar66);
                local_4c0._0_4_ =
                     (uint)(bVar85 & 1) * (int)fVar174 | (uint)!(bool)(bVar85 & 1) * auVar114._0_4_;
                bVar12 = (bool)((byte)(uVar76 >> 1) & 1);
                local_4c0._4_4_ = (uint)bVar12 * (int)fVar194 | (uint)!bVar12 * auVar114._4_4_;
                bVar12 = (bool)((byte)(uVar76 >> 2) & 1);
                local_4c0._8_4_ = (uint)bVar12 * (int)fVar195 | (uint)!bVar12 * auVar114._8_4_;
                bVar12 = (bool)((byte)(uVar76 >> 3) & 1);
                local_4c0._12_4_ = (uint)bVar12 * (int)fVar176 | (uint)!bVar12 * auVar114._12_4_;
                bVar12 = (bool)((byte)(uVar76 >> 4) & 1);
                local_4c0._16_4_ = (uint)bVar12 * (int)fVar86 | (uint)!bVar12 * auVar114._16_4_;
                bVar12 = (bool)((byte)(uVar76 >> 5) & 1);
                local_4c0._20_4_ = (uint)bVar12 * (int)fVar87 | (uint)!bVar12 * auVar114._20_4_;
                bVar12 = (bool)((byte)(uVar76 >> 6) & 1);
                local_4c0._24_4_ = (uint)bVar12 * (int)fVar138 | (uint)!bVar12 * auVar114._24_4_;
                bVar12 = SUB81(uVar76 >> 7,0);
                local_4c0._28_4_ = (uint)bVar12 * auVar102._28_4_ | (uint)!bVar12 * auVar114._28_4_;
                auVar114 = vsubps_avx(auVar199,auVar67);
                bVar12 = (bool)((byte)(uVar76 >> 1) & 1);
                bVar13 = (bool)((byte)(uVar76 >> 2) & 1);
                bVar14 = (bool)((byte)(uVar76 >> 3) & 1);
                bVar15 = (bool)((byte)(uVar76 >> 4) & 1);
                bVar16 = (bool)((byte)(uVar76 >> 5) & 1);
                bVar17 = (bool)((byte)(uVar76 >> 6) & 1);
                bVar18 = SUB81(uVar76 >> 7,0);
                local_1c0._4_4_ = (uint)bVar12 * (int)fVar173 | (uint)!bVar12 * auVar114._4_4_;
                local_1c0._0_4_ =
                     (uint)(bVar85 & 1) * (int)fVar178 | (uint)!(bool)(bVar85 & 1) * auVar114._0_4_;
                local_1c0._8_4_ = (uint)bVar13 * (int)fVar177 | (uint)!bVar13 * auVar114._8_4_;
                local_1c0._12_4_ = (uint)bVar14 * (int)fVar193 | (uint)!bVar14 * auVar114._12_4_;
                local_1c0._16_4_ = (uint)bVar15 * (int)fVar139 | (uint)!bVar15 * auVar114._16_4_;
                local_1c0._20_4_ = (uint)bVar16 * (int)fVar140 | (uint)!bVar16 * auVar114._20_4_;
                local_1c0._24_4_ = (uint)bVar17 * (int)fVar141 | (uint)!bVar17 * auVar114._24_4_;
                local_1c0._28_4_ = (uint)bVar18 * auVar103._28_4_ | (uint)!bVar18 * auVar114._28_4_;
                local_4e0 = auVar116;
              }
            }
            auVar220 = ZEXT3264(local_540);
            auVar218 = ZEXT3264(local_560);
            if (local_230 != 0) {
              auVar114 = vsubps_avx(ZEXT1632(auVar95),auVar105);
              auVar96 = vfmadd213ps_fma(auVar114,local_4c0,auVar105);
              fVar174 = local_5e8->depth_scale;
              auVar39._4_4_ = fVar174;
              auVar39._0_4_ = fVar174;
              auVar39._8_4_ = fVar174;
              auVar39._12_4_ = fVar174;
              auVar39._16_4_ = fVar174;
              auVar39._20_4_ = fVar174;
              auVar39._24_4_ = fVar174;
              auVar39._28_4_ = fVar174;
              auVar114 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar96._12_4_ + auVar96._12_4_,
                                                            CONCAT48(auVar96._8_4_ + auVar96._8_4_,
                                                                     CONCAT44(auVar96._4_4_ +
                                                                              auVar96._4_4_,
                                                                              auVar96._0_4_ +
                                                                              auVar96._0_4_)))),
                                         auVar39);
              uVar146 = vcmpps_avx512vl(local_4e0,auVar114,6);
              local_230 = local_230 & (byte)uVar146;
              uVar83 = (uint)local_230;
              if (local_230 != 0) {
                auVar151._8_4_ = 0xbf800000;
                auVar151._0_8_ = 0xbf800000bf800000;
                auVar151._12_4_ = 0xbf800000;
                auVar151._16_4_ = 0xbf800000;
                auVar151._20_4_ = 0xbf800000;
                auVar151._24_4_ = 0xbf800000;
                auVar151._28_4_ = 0xbf800000;
                auVar40._8_4_ = 0x40000000;
                auVar40._0_8_ = 0x4000000040000000;
                auVar40._12_4_ = 0x40000000;
                auVar40._16_4_ = 0x40000000;
                auVar40._20_4_ = 0x40000000;
                auVar40._24_4_ = 0x40000000;
                auVar40._28_4_ = 0x40000000;
                local_1c0 = vfmadd132ps_avx512vl(local_1c0,auVar151,auVar40);
                local_2e0 = local_4c0;
                auVar114 = local_1c0;
                local_2c0 = local_1c0;
                local_2a0 = local_4e0;
                local_280 = (int)lVar82;
                local_27c = iVar8;
                local_270 = local_5b0._0_8_;
                uStack_268 = local_5b0._8_8_;
                local_260 = local_4f0._0_8_;
                uStack_258 = local_4f0._8_8_;
                local_250 = local_500._0_8_;
                uStack_248 = local_500._8_8_;
                local_240 = local_510;
                uStack_238 = uStack_508;
                pGVar81 = (context->scene->geometries).items[local_5f8].ptr;
                local_1c0 = auVar114;
                if ((pGVar81->mask & (ray->super_RayK<1>).mask) != 0) {
                  auVar96 = vcvtsi2ss_avx512f(auVar219._0_16_,(int)lVar82);
                  fVar174 = auVar96._0_4_;
                  local_220[0] = (fVar174 + local_4c0._0_4_ + 0.0) * (float)local_300._0_4_;
                  local_220[1] = (fVar174 + local_4c0._4_4_ + 1.0) * (float)local_300._4_4_;
                  local_220[2] = (fVar174 + local_4c0._8_4_ + 2.0) * fStack_2f8;
                  local_220[3] = (fVar174 + local_4c0._12_4_ + 3.0) * fStack_2f4;
                  fStack_210 = (fVar174 + local_4c0._16_4_ + 4.0) * fStack_2f0;
                  fStack_20c = (fVar174 + local_4c0._20_4_ + 5.0) * fStack_2ec;
                  fStack_208 = (fVar174 + local_4c0._24_4_ + 6.0) * fStack_2e8;
                  fStack_204 = fVar174 + local_4c0._28_4_ + 7.0;
                  local_200 = local_1c0._0_8_;
                  uStack_1f8 = local_1c0._8_8_;
                  uStack_1f0 = local_1c0._16_8_;
                  uStack_1e8 = local_1c0._24_8_;
                  local_1e0 = local_4e0;
                  auVar152._8_4_ = 0x7f800000;
                  auVar152._0_8_ = 0x7f8000007f800000;
                  auVar152._12_4_ = 0x7f800000;
                  auVar152._16_4_ = 0x7f800000;
                  auVar152._20_4_ = 0x7f800000;
                  auVar152._24_4_ = 0x7f800000;
                  auVar152._28_4_ = 0x7f800000;
                  auVar116 = vblendmps_avx512vl(auVar152,local_4e0);
                  auVar135._0_4_ =
                       (uint)(local_230 & 1) * auVar116._0_4_ |
                       (uint)!(bool)(local_230 & 1) * 0x7f800000;
                  bVar12 = (bool)(local_230 >> 1 & 1);
                  auVar135._4_4_ = (uint)bVar12 * auVar116._4_4_ | (uint)!bVar12 * 0x7f800000;
                  bVar12 = (bool)(local_230 >> 2 & 1);
                  auVar135._8_4_ = (uint)bVar12 * auVar116._8_4_ | (uint)!bVar12 * 0x7f800000;
                  bVar12 = (bool)(local_230 >> 3 & 1);
                  auVar135._12_4_ = (uint)bVar12 * auVar116._12_4_ | (uint)!bVar12 * 0x7f800000;
                  bVar12 = (bool)(local_230 >> 4 & 1);
                  auVar135._16_4_ = (uint)bVar12 * auVar116._16_4_ | (uint)!bVar12 * 0x7f800000;
                  bVar12 = (bool)(local_230 >> 5 & 1);
                  auVar135._20_4_ = (uint)bVar12 * auVar116._20_4_ | (uint)!bVar12 * 0x7f800000;
                  bVar12 = (bool)(local_230 >> 6 & 1);
                  auVar135._24_4_ = (uint)bVar12 * auVar116._24_4_ | (uint)!bVar12 * 0x7f800000;
                  auVar135._28_4_ =
                       (uint)(local_230 >> 7) * auVar116._28_4_ |
                       (uint)!(bool)(local_230 >> 7) * 0x7f800000;
                  auVar116 = vshufps_avx(auVar135,auVar135,0xb1);
                  auVar116 = vminps_avx(auVar135,auVar116);
                  auVar112 = vshufpd_avx(auVar116,auVar116,5);
                  auVar116 = vminps_avx(auVar116,auVar112);
                  auVar112 = vpermpd_avx2(auVar116,0x4e);
                  auVar116 = vminps_avx(auVar116,auVar112);
                  uVar146 = vcmpps_avx512vl(auVar135,auVar116,0);
                  bVar75 = (byte)uVar146 & local_230;
                  bVar85 = local_230;
                  if (bVar75 != 0) {
                    bVar85 = bVar75;
                  }
                  uVar79 = 0;
                  for (uVar78 = (uint)bVar85; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x80000000)
                  {
                    uVar79 = uVar79 + 1;
                  }
                  uVar76 = (ulong)uVar79;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar81->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar174 = local_220[uVar76];
                    fVar178 = *(float *)((long)&local_200 + uVar76 * 4);
                    fVar173 = 1.0 - fVar174;
                    auVar31._8_4_ = 0x80000000;
                    auVar31._0_8_ = 0x8000000080000000;
                    auVar31._12_4_ = 0x80000000;
                    auVar89 = vxorps_avx512vl(ZEXT416((uint)fVar173),auVar31);
                    auVar96 = ZEXT416((uint)(fVar174 * fVar173 * 4.0));
                    auVar95 = vfnmsub213ss_fma(ZEXT416((uint)fVar174),ZEXT416((uint)fVar174),auVar96
                                              );
                    auVar96 = vfmadd213ss_fma(ZEXT416((uint)fVar173),ZEXT416((uint)fVar173),auVar96)
                    ;
                    fVar173 = fVar173 * auVar89._0_4_ * 0.5;
                    fVar177 = auVar95._0_4_ * 0.5;
                    fVar193 = auVar96._0_4_ * 0.5;
                    fVar194 = fVar174 * fVar174 * 0.5;
                    auVar183._0_4_ = fVar194 * (float)local_510._0_4_;
                    auVar183._4_4_ = fVar194 * (float)local_510._4_4_;
                    auVar183._8_4_ = fVar194 * (float)uStack_508;
                    auVar183._12_4_ = fVar194 * uStack_508._4_4_;
                    auVar167._4_4_ = fVar193;
                    auVar167._0_4_ = fVar193;
                    auVar167._8_4_ = fVar193;
                    auVar167._12_4_ = fVar193;
                    auVar96 = vfmadd132ps_fma(auVar167,auVar183,local_500);
                    auVar184._4_4_ = fVar177;
                    auVar184._0_4_ = fVar177;
                    auVar184._8_4_ = fVar177;
                    auVar184._12_4_ = fVar177;
                    auVar96 = vfmadd132ps_fma(auVar184,auVar96,local_4f0);
                    auVar168._4_4_ = fVar173;
                    auVar168._0_4_ = fVar173;
                    auVar168._8_4_ = fVar173;
                    auVar168._12_4_ = fVar173;
                    (ray->super_RayK<1>).tfar = *(float *)(local_1e0 + uVar76 * 4);
                    auVar96 = vfmadd132ps_fma(auVar168,auVar96,local_5b0);
                    uVar146 = vmovlps_avx(auVar96);
                    *(undefined8 *)&(ray->Ng).field_0 = uVar146;
                    fVar173 = (float)vextractps_avx(auVar96,2);
                    (ray->Ng).field_0.field_0.z = fVar173;
                    ray->u = fVar174;
                    ray->v = fVar178;
                    ray->primID = (uint)local_5f0;
                    ray->geomID = (uint)local_5f8;
                    ray->instID[0] = context->user->instID[0];
                    ray->instPrimID[0] = context->user->instPrimID[0];
                  }
                  else {
                    local_410 = local_4f0._0_8_;
                    uStack_408 = local_4f0._8_8_;
                    local_420 = local_500._0_4_;
                    fStack_41c = local_500._4_4_;
                    fStack_418 = local_500._8_4_;
                    fStack_414 = local_500._12_4_;
                    _local_520 = _local_510;
                    local_568 = pGVar81;
                    local_160 = vmovdqa64_avx512vl(auVar214._0_32_);
                    do {
                      auVar224 = auVar225._0_16_;
                      local_594 = local_220[uVar76];
                      local_590 = *(undefined4 *)((long)&local_200 + uVar76 * 4);
                      local_400 = (ray->super_RayK<1>).tfar;
                      (ray->super_RayK<1>).tfar = *(float *)(local_1e0 + uVar76 * 4);
                      local_5e0.context = context->user;
                      fVar174 = 1.0 - local_594;
                      auVar32._8_4_ = 0x80000000;
                      auVar32._0_8_ = 0x8000000080000000;
                      auVar32._12_4_ = 0x80000000;
                      auVar89 = vxorps_avx512vl(ZEXT416((uint)fVar174),auVar32);
                      auVar96 = ZEXT416((uint)(local_594 * fVar174 * 4.0));
                      auVar95 = vfnmsub213ss_fma(ZEXT416((uint)local_594),ZEXT416((uint)local_594),
                                                 auVar96);
                      auVar96 = vfmadd213ss_fma(ZEXT416((uint)fVar174),ZEXT416((uint)fVar174),
                                                auVar96);
                      fVar174 = fVar174 * auVar89._0_4_ * 0.5;
                      fVar178 = auVar95._0_4_ * 0.5;
                      fVar173 = auVar96._0_4_ * 0.5;
                      fVar177 = local_594 * local_594 * 0.5;
                      auVar185._0_4_ = fVar177 * (float)local_520._0_4_;
                      auVar185._4_4_ = fVar177 * (float)local_520._4_4_;
                      auVar185._8_4_ = fVar177 * fStack_518;
                      auVar185._12_4_ = fVar177 * fStack_514;
                      auVar169._4_4_ = fVar173;
                      auVar169._0_4_ = fVar173;
                      auVar169._8_4_ = fVar173;
                      auVar169._12_4_ = fVar173;
                      auVar68._4_4_ = fStack_41c;
                      auVar68._0_4_ = local_420;
                      auVar68._8_4_ = fStack_418;
                      auVar68._12_4_ = fStack_414;
                      auVar96 = vfmadd132ps_fma(auVar169,auVar185,auVar68);
                      auVar186._4_4_ = fVar178;
                      auVar186._0_4_ = fVar178;
                      auVar186._8_4_ = fVar178;
                      auVar186._12_4_ = fVar178;
                      auVar69._8_8_ = uStack_408;
                      auVar69._0_8_ = local_410;
                      auVar96 = vfmadd132ps_fma(auVar186,auVar96,auVar69);
                      auVar170._4_4_ = fVar174;
                      auVar170._0_4_ = fVar174;
                      auVar170._8_4_ = fVar174;
                      auVar170._12_4_ = fVar174;
                      auVar96 = vfmadd132ps_fma(auVar170,auVar96,local_5b0);
                      local_5a0 = vmovlps_avx(auVar96);
                      local_598 = vextractps_avx(auVar96,2);
                      local_58c = (int)local_5f0;
                      local_588 = (int)local_5f8;
                      local_584 = (local_5e0.context)->instID[0];
                      local_580 = (local_5e0.context)->instPrimID[0];
                      local_5fc = -1;
                      local_5e0.valid = &local_5fc;
                      local_5e0.geometryUserPtr = pGVar81->userPtr;
                      local_5e0.ray = (RTCRayN *)ray;
                      local_5e0.hit = (RTCHitN *)&local_5a0;
                      local_5e0.N = 1;
                      if (pGVar81->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01c459ba:
                        auVar96 = auVar225._0_16_;
                        p_Var11 = context->args->filter;
                        if (p_Var11 != (RTCFilterFunctionN)0x0) {
                          if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar81->field_8).field_0x2 & 0x40) != 0)) {
                            (*p_Var11)(&local_5e0);
                            auVar114 = vmovdqa64_avx512vl(local_160);
                            auVar214 = ZEXT3264(auVar114);
                            auVar228 = ZEXT3264(local_4a0);
                            auVar227 = ZEXT3264(local_480);
                            auVar226 = ZEXT3264(local_460);
                            auVar218 = ZEXT3264(local_560);
                            auVar220 = ZEXT3264(local_540);
                            auVar223 = ZEXT3264(local_380);
                            auVar222 = ZEXT3264(local_340);
                            auVar221 = ZEXT3264(local_360);
                            auVar96 = vxorps_avx512vl(auVar96,auVar96);
                            auVar225 = ZEXT1664(auVar96);
                            pGVar81 = local_568;
                          }
                          if (*local_5e0.valid == 0) goto LAB_01c45ab3;
                        }
                        (((Vec3f *)((long)local_5e0.ray + 0x30))->field_0).components[0] =
                             *(float *)local_5e0.hit;
                        (((Vec3f *)((long)local_5e0.ray + 0x30))->field_0).field_0.y =
                             *(float *)(local_5e0.hit + 4);
                        (((Vec3f *)((long)local_5e0.ray + 0x30))->field_0).field_0.z =
                             *(float *)(local_5e0.hit + 8);
                        *(float *)((long)local_5e0.ray + 0x3c) = *(float *)(local_5e0.hit + 0xc);
                        *(float *)((long)local_5e0.ray + 0x40) = *(float *)(local_5e0.hit + 0x10);
                        *(float *)((long)local_5e0.ray + 0x44) = *(float *)(local_5e0.hit + 0x14);
                        *(float *)((long)local_5e0.ray + 0x48) = *(float *)(local_5e0.hit + 0x18);
                        *(float *)((long)local_5e0.ray + 0x4c) = *(float *)(local_5e0.hit + 0x1c);
                        *(float *)((long)local_5e0.ray + 0x50) = *(float *)(local_5e0.hit + 0x20);
                      }
                      else {
                        (*pGVar81->intersectionFilterN)(&local_5e0);
                        auVar114 = vmovdqa64_avx512vl(local_160);
                        auVar214 = ZEXT3264(auVar114);
                        auVar228 = ZEXT3264(local_4a0);
                        auVar227 = ZEXT3264(local_480);
                        auVar226 = ZEXT3264(local_460);
                        auVar218 = ZEXT3264(local_560);
                        auVar220 = ZEXT3264(local_540);
                        auVar223 = ZEXT3264(local_380);
                        auVar222 = ZEXT3264(local_340);
                        auVar221 = ZEXT3264(local_360);
                        auVar96 = vxorps_avx512vl(auVar224,auVar224);
                        auVar225 = ZEXT1664(auVar96);
                        pGVar81 = local_568;
                        if (*local_5e0.valid != 0) goto LAB_01c459ba;
LAB_01c45ab3:
                        (ray->super_RayK<1>).tfar = local_400;
                      }
                      bVar75 = ~(byte)(1 << ((uint)uVar76 & 0x1f)) & (byte)uVar83;
                      fVar174 = (ray->super_RayK<1>).tfar;
                      auVar41._4_4_ = fVar174;
                      auVar41._0_4_ = fVar174;
                      auVar41._8_4_ = fVar174;
                      auVar41._12_4_ = fVar174;
                      auVar41._16_4_ = fVar174;
                      auVar41._20_4_ = fVar174;
                      auVar41._24_4_ = fVar174;
                      auVar41._28_4_ = fVar174;
                      uVar146 = vcmpps_avx512vl(local_4e0,auVar41,2);
                      bVar85 = bVar75 & (byte)uVar146;
                      uVar83 = (uint)bVar85;
                      if ((bVar75 & (byte)uVar146) != 0) {
                        auVar153._8_4_ = 0x7f800000;
                        auVar153._0_8_ = 0x7f8000007f800000;
                        auVar153._12_4_ = 0x7f800000;
                        auVar153._16_4_ = 0x7f800000;
                        auVar153._20_4_ = 0x7f800000;
                        auVar153._24_4_ = 0x7f800000;
                        auVar153._28_4_ = 0x7f800000;
                        auVar114 = vblendmps_avx512vl(auVar153,local_4e0);
                        auVar136._0_4_ =
                             (uint)(bVar85 & 1) * auVar114._0_4_ |
                             (uint)!(bool)(bVar85 & 1) * 0x7f800000;
                        bVar12 = (bool)(bVar85 >> 1 & 1);
                        auVar136._4_4_ = (uint)bVar12 * auVar114._4_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar85 >> 2 & 1);
                        auVar136._8_4_ = (uint)bVar12 * auVar114._8_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar85 >> 3 & 1);
                        auVar136._12_4_ =
                             (uint)bVar12 * auVar114._12_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar85 >> 4 & 1);
                        auVar136._16_4_ =
                             (uint)bVar12 * auVar114._16_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar85 >> 5 & 1);
                        auVar136._20_4_ =
                             (uint)bVar12 * auVar114._20_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar85 >> 6 & 1);
                        auVar136._24_4_ =
                             (uint)bVar12 * auVar114._24_4_ | (uint)!bVar12 * 0x7f800000;
                        auVar136._28_4_ =
                             (uint)(bVar85 >> 7) * auVar114._28_4_ |
                             (uint)!(bool)(bVar85 >> 7) * 0x7f800000;
                        auVar114 = vshufps_avx(auVar136,auVar136,0xb1);
                        auVar114 = vminps_avx(auVar136,auVar114);
                        auVar116 = vshufpd_avx(auVar114,auVar114,5);
                        auVar114 = vminps_avx(auVar114,auVar116);
                        auVar116 = vpermpd_avx2(auVar114,0x4e);
                        auVar114 = vminps_avx(auVar114,auVar116);
                        uVar146 = vcmpps_avx512vl(auVar136,auVar114,0);
                        bVar75 = (byte)uVar146 & bVar85;
                        uVar79 = uVar83;
                        if (bVar75 != 0) {
                          uVar79 = (uint)bVar75;
                        }
                        uVar78 = 0;
                        for (; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x80000000) {
                          uVar78 = uVar78 + 1;
                        }
                        uVar76 = (ulong)uVar78;
                      }
                    } while (bVar85 != 0);
                  }
                }
              }
            }
          }
          lVar82 = lVar82 + 8;
          auVar219 = auVar220;
        } while ((int)lVar82 < iVar8);
      }
      fVar174 = (ray->super_RayK<1>).tfar;
      auVar30._4_4_ = fVar174;
      auVar30._0_4_ = fVar174;
      auVar30._8_4_ = fVar174;
      auVar30._12_4_ = fVar174;
      uVar146 = vcmpps_avx512vl(local_170,auVar30,2);
      uVar83 = (uint)uVar84 & (uint)uVar84 + 0xf & (uint)uVar146;
      uVar84 = (ulong)uVar83;
    } while (uVar83 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }